

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::NewFrame(void)

{
  ImVec2 *pIVar1;
  int *piVar2;
  ImGuiNextWindowData *pIVar3;
  ImS8 *pIVar4;
  float *pfVar5;
  ImVec2 *pIVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  ImGuiNavLayer IVar9;
  uint uVar10;
  ImGuiContextHook *pIVar11;
  ImFontAtlas *pIVar12;
  ImGuiPlatformMonitor *pIVar13;
  uint *puVar14;
  _func_bool_ImGuiViewport_ptr *p_Var15;
  ImGuiWindow **ppIVar16;
  ImGuiViewport **ppIVar17;
  _func_float_ImGuiViewport_ptr *p_Var18;
  ImGuiViewportP **ppIVar19;
  _func_void_ImGuiViewport_ptr *p_Var20;
  ImGuiTableTempData *pIVar21;
  ImGuiWindowStackData *pIVar22;
  ImGuiPopupData *pIVar23;
  ImGuiGroupData *pIVar24;
  ImGuiStackLevelInfo *pIVar25;
  undefined1 auVar26 [12];
  ImGuiContext *ctx_00;
  ImGuiContext *pIVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  uint uVar32;
  ImGuiID IVar33;
  ImGuiInputSource IVar34;
  ImGuiNavLayer layer;
  ImGuiContext *g_2;
  uint *__dest;
  ImGuiViewport **ppIVar35;
  ImGuiViewportP *pIVar36;
  ImGuiWindow *pIVar37;
  ImGuiWindowStackData *__dest_00;
  ImGuiPopupData *__dest_01;
  int *piVar38;
  int *piVar39;
  ImGuiGroupData *__dest_02;
  ImGuiStackLevelInfo *__dest_03;
  int i;
  ImGuiID IVar40;
  undefined4 uVar41;
  ImGuiWindow *window_00;
  char *pcVar42;
  ImGuiNavMoveFlags move_flags;
  ImGuiWindow *parent;
  ulong uVar43;
  ImGuiViewportP *pIVar44;
  ImGuiWindow *pIVar45;
  ImGuiContext *g;
  int i_1;
  ImRect *pIVar46;
  ImGuiContext *pIVar47;
  ImGuiNavDirSourceFlags dir_sources;
  ImFont *font;
  float *pfVar48;
  ImGuiViewportP *pIVar49;
  ImGuiContext *ctx;
  ImGuiContext *g_1;
  ImGuiWindow *window;
  ulong uVar50;
  long lVar51;
  bool *pbVar52;
  ImGuiWindow *old_nav_window;
  long lVar53;
  ImGuiContext *pIVar54;
  byte bVar55;
  int iVar56;
  uint uVar57;
  int iVar58;
  int iVar59;
  uint uVar60;
  float fVar61;
  ImVec2 IVar62;
  ImVec2 IVar63;
  ImVec2 IVar64;
  ImVec2 IVar66;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  double dVar65;
  undefined1 auVar71 [16];
  float fVar72;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  float fVar75;
  float fVar76;
  float fVar77;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  float fVar82;
  float fVar83;
  float fVar85;
  undefined1 auVar84 [16];
  float local_88;
  undefined1 local_58 [24];
  ImVec2 local_40;
  undefined4 local_34;
  undefined1 auVar67 [16];
  
  ctx_00 = GImGui;
  bVar55 = 0;
  if (GImGui == (ImGuiContext *)0x0) {
    __assert_fail("GImGui != __null && \"No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                  ,0x1003,"void ImGui::NewFrame()");
  }
  uVar32 = (GImGui->Hooks).Size;
  uVar50 = (ulong)(int)uVar32;
  if (0 < (long)uVar50) {
    lVar53 = -uVar50;
    lVar51 = uVar50 << 5;
    do {
      if ((long)(int)uVar32 < (long)uVar50) {
        pcVar42 = "T &ImVector<ImGuiContextHook>::operator[](int) [T = ImGuiContextHook]";
        goto LAB_0012bd48;
      }
      pIVar11 = (ctx_00->Hooks).Data;
      if (*(int *)(pIVar11 + lVar51 + -0x1c) == 7) {
        memmove(pIVar11 + lVar51 + -0x20,pIVar11 + lVar51,((ulong)uVar32 + lVar53) * 0x20);
        uVar32 = (ctx_00->Hooks).Size - 1;
        (ctx_00->Hooks).Size = uVar32;
      }
      lVar53 = lVar53 + 1;
      bVar28 = 1 < uVar50;
      uVar50 = uVar50 - 1;
      lVar51 = lVar51 + -0x20;
    } while (bVar28);
    if (0 < (int)uVar32) {
      lVar51 = 0;
      lVar53 = 0;
      do {
        pIVar11 = (ctx_00->Hooks).Data;
        if (*(int *)(pIVar11 + lVar51 + 4) == 0) {
          (**(code **)(pIVar11 + lVar51 + 0x10))(ctx_00,pIVar11 + lVar51);
          uVar32 = (ctx_00->Hooks).Size;
        }
        lVar53 = lVar53 + 1;
        lVar51 = lVar51 + 0x20;
      } while (lVar53 < (int)uVar32);
    }
  }
  ctx_00->ConfigFlagsLastFrame = ctx_00->ConfigFlagsCurrFrame;
  pIVar54 = GImGui;
  if (GImGui->Initialized == false) {
    __assert_fail("g.Initialized",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                  ,0x1eb0,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  iVar56 = GImGui->FrameCount;
  if ((GImGui->IO).DeltaTime <= 0.0) {
    if (iVar56 != 0) {
      __assert_fail("(g.IO.DeltaTime > 0.0f || g.FrameCount == 0) && \"Need a positive DeltaTime!\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                    ,0x1eb1,"void ImGui::ErrorCheckNewFrameSanityChecks()");
    }
LAB_00128278:
    iVar56 = 0;
    bVar28 = true;
  }
  else {
    if (iVar56 == 0) goto LAB_00128278;
    if (GImGui->FrameCountEnded != iVar56) {
      __assert_fail("(g.FrameCount == 0 || g.FrameCountEnded == g.FrameCount) && \"Forgot to call Render() or EndFrame() at the end of the previous frame?\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                    ,0x1eb2,"void ImGui::ErrorCheckNewFrameSanityChecks()");
    }
    bVar28 = false;
  }
  if (((GImGui->IO).DisplaySize.x < 0.0) || ((GImGui->IO).DisplaySize.y < 0.0)) {
    __assert_fail("g.IO.DisplaySize.x >= 0.0f && g.IO.DisplaySize.y >= 0.0f && \"Invalid DisplaySize value!\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                  ,0x1eb3,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  pIVar12 = (GImGui->IO).Fonts;
  if (((pIVar12->Fonts).Size < 1) || ((pIVar12->TexReady & 1U) == 0)) {
    __assert_fail("g.IO.Fonts->IsBuilt() && \"Font Atlas not built! Make sure you called ImGui_ImplXXXX_NewFrame() function for renderer backend, which should call io.Fonts->GetTexDataAsRGBA32() / GetTexDataAsAlpha8()\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                  ,0x1eb4,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if ((GImGui->Style).CurveTessellationTol <= 0.0) {
    __assert_fail("g.Style.CurveTessellationTol > 0.0f && \"Invalid style setting!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                  ,0x1eb5,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if ((GImGui->Style).CircleTessellationMaxError <= 0.0) {
    __assert_fail("g.Style.CircleTessellationMaxError > 0.0f && \"Invalid style setting!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                  ,0x1eb6,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  fVar61 = (GImGui->Style).Alpha;
  if ((fVar61 < 0.0) || (1.0 < fVar61)) {
    __assert_fail("g.Style.Alpha >= 0.0f && g.Style.Alpha <= 1.0f && \"Invalid style setting!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                  ,0x1eb7,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (((GImGui->Style).WindowMinSize.x < 1.0) || ((GImGui->Style).WindowMinSize.y < 1.0)) {
    __assert_fail("g.Style.WindowMinSize.x >= 1.0f && g.Style.WindowMinSize.y >= 1.0f && \"Invalid style setting.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                  ,0x1eb8,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (2 < (GImGui->Style).WindowMenuButtonPosition + 1U) {
    __assert_fail("g.Style.WindowMenuButtonPosition == ImGuiDir_None || g.Style.WindowMenuButtonPosition == ImGuiDir_Left || g.Style.WindowMenuButtonPosition == ImGuiDir_Right"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                  ,0x1eb9,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  lVar51 = 0;
  do {
    if (0x200 < (GImGui->IO).KeyMap[lVar51] + 1U) {
      __assert_fail("g.IO.KeyMap[n] >= -1 && g.IO.KeyMap[n] < ((int)(sizeof(g.IO.KeysDown) / sizeof(*(g.IO.KeysDown)))) && \"io.KeyMap[] contains an out of bound value (need to be 0..512, or -1 for unmapped key)\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                    ,0x1ebb,"void ImGui::ErrorCheckNewFrameSanityChecks()");
    }
    lVar51 = lVar51 + 1;
  } while (lVar51 != 0x16);
  uVar32 = (GImGui->IO).ConfigFlags;
  if (((uVar32 & 1) != 0) && ((GImGui->IO).KeyMap[0xc] == -1)) {
    __assert_fail("g.IO.KeyMap[ImGuiKey_Space] != -1 && \"ImGuiKey_Space is not mapped, required for keyboard navigation.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                  ,0x1ebf,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (((GImGui->IO).ConfigWindowsResizeFromEdges == true) && (((GImGui->IO).BackendFlags & 2) == 0))
  {
    (GImGui->IO).ConfigWindowsResizeFromEdges = false;
  }
  if (iVar56 == 1) {
    if (((uVar32 & 0x40) != 0) && ((pIVar54->ConfigFlagsLastFrame & 0x40) == 0)) {
      __assert_fail("0 && \"Please set DockingEnable before the first call to NewFrame()! Otherwise you will lose your .ini settings!\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                    ,0x1ec7,"void ImGui::ErrorCheckNewFrameSanityChecks()");
    }
    if ((uVar32 >> 10 & 1) == 0) goto LAB_00128588;
    if ((pIVar54->ConfigFlagsLastFrame & 0x400) == 0) {
      __assert_fail("0 && \"Please set ViewportsEnable before the first call to NewFrame()! Otherwise you will lose your .ini settings!\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                    ,0x1ec9,"void ImGui::ErrorCheckNewFrameSanityChecks()");
    }
LAB_001283e0:
    if ((~(pIVar54->IO).BackendFlags & 0x1400U) != 0) {
      (pIVar54->IO).ConfigFlags = uVar32 & 0xfffffbff;
      uVar60 = (pIVar54->PlatformIO).Monitors.Size;
      if (0 < (int)uVar60) goto LAB_001284e1;
      goto LAB_00128588;
    }
    if ((!bVar28) && (iVar56 != pIVar54->FrameCountPlatformEnded)) {
      __assert_fail("(g.FrameCount == 0 || g.FrameCount == g.FrameCountPlatformEnded) && \"Forgot to call UpdatePlatformWindows() in main loop after EndFrame()? Check examples/ applications for reference.\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                    ,0x1ed0,"void ImGui::ErrorCheckNewFrameSanityChecks()");
    }
    if ((pIVar54->PlatformIO).Platform_CreateWindow == (_func_void_ImGuiViewport_ptr *)0x0) {
      __assert_fail("g.PlatformIO.Platform_CreateWindow != __null && \"Platform init didn\'t install handlers?\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                    ,0x1ed1,"void ImGui::ErrorCheckNewFrameSanityChecks()");
    }
    if ((pIVar54->PlatformIO).Platform_DestroyWindow == (_func_void_ImGuiViewport_ptr *)0x0) {
      __assert_fail("g.PlatformIO.Platform_DestroyWindow != __null && \"Platform init didn\'t install handlers?\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                    ,0x1ed2,"void ImGui::ErrorCheckNewFrameSanityChecks()");
    }
    if ((pIVar54->PlatformIO).Platform_GetWindowPos == (_func_ImVec2_ImGuiViewport_ptr *)0x0) {
      __assert_fail("g.PlatformIO.Platform_GetWindowPos != __null && \"Platform init didn\'t install handlers?\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                    ,0x1ed3,"void ImGui::ErrorCheckNewFrameSanityChecks()");
    }
    if ((pIVar54->PlatformIO).Platform_SetWindowPos == (_func_void_ImGuiViewport_ptr_ImVec2 *)0x0) {
      __assert_fail("g.PlatformIO.Platform_SetWindowPos != __null && \"Platform init didn\'t install handlers?\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                    ,0x1ed4,"void ImGui::ErrorCheckNewFrameSanityChecks()");
    }
    if ((pIVar54->PlatformIO).Platform_GetWindowSize == (_func_ImVec2_ImGuiViewport_ptr *)0x0) {
      __assert_fail("g.PlatformIO.Platform_GetWindowSize != __null && \"Platform init didn\'t install handlers?\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                    ,0x1ed5,"void ImGui::ErrorCheckNewFrameSanityChecks()");
    }
    if ((pIVar54->PlatformIO).Platform_SetWindowSize == (_func_void_ImGuiViewport_ptr_ImVec2 *)0x0)
    {
      __assert_fail("g.PlatformIO.Platform_SetWindowSize != __null && \"Platform init didn\'t install handlers?\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                    ,0x1ed6,"void ImGui::ErrorCheckNewFrameSanityChecks()");
    }
    uVar60 = (pIVar54->PlatformIO).Monitors.Size;
    if ((int)uVar60 < 1) {
      __assert_fail("g.PlatformIO.Monitors.Size > 0 && \"Platform init didn\'t setup Monitors list?\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                    ,0x1ed7,"void ImGui::ErrorCheckNewFrameSanityChecks()");
    }
    if (0 < (pIVar54->Viewports).Size) {
      pIVar49 = *(pIVar54->Viewports).Data;
      if (((pIVar49->super_ImGuiViewport).PlatformUserData == (void *)0x0) &&
         ((pIVar49->super_ImGuiViewport).PlatformHandle == (void *)0x0)) {
        __assert_fail("(g.Viewports[0]->PlatformUserData != __null || g.Viewports[0]->PlatformHandle != __null) && \"Platform init didn\'t setup main viewport.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                      ,0x1ed8,"void ImGui::ErrorCheckNewFrameSanityChecks()");
      }
      if ((((uVar32 & 0x40) != 0) && ((pIVar54->IO).ConfigDockingTransparentPayload != false)) &&
         ((pIVar54->PlatformIO).Platform_SetWindowAlpha == (_func_void_ImGuiViewport_ptr_float *)0x0
         )) {
        __assert_fail("g.PlatformIO.Platform_SetWindowAlpha != __null && \"Platform_SetWindowAlpha handler is required to use io.ConfigDockingTransparent!\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                      ,0x1eda,"void ImGui::ErrorCheckNewFrameSanityChecks()");
      }
LAB_001284e1:
      pIVar13 = (pIVar54->PlatformIO).Monitors.Data;
      lVar51 = 0;
      do {
        uVar7 = *(undefined8 *)((long)&(pIVar13->MainSize).x + lVar51);
        fVar61 = (float)uVar7;
        if ((fVar61 <= 0.0) || (fVar76 = (float)((ulong)uVar7 >> 0x20), fVar76 <= 0.0)) {
          __assert_fail("mon.MainSize.x > 0.0f && mon.MainSize.y > 0.0f && \"Monitor main bounds not setup properly.\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                        ,0x1ee7,"void ImGui::ErrorCheckNewFrameSanityChecks()");
        }
        uVar7 = *(undefined8 *)((long)&(pIVar13->MainPos).x + lVar51);
        uVar8 = *(undefined8 *)((long)&(pIVar13->WorkPos).x + lVar51);
        fVar83 = (float)uVar8;
        fVar77 = (float)uVar7;
        if (fVar83 < fVar77) {
LAB_0012bcbf:
          __assert_fail("ImRect(mon.MainPos, mon.MainPos + mon.MainSize).Contains(ImRect(mon.WorkPos, mon.WorkPos + mon.WorkSize)) && \"Monitor work bounds not setup properly. If you don\'t have work area information, just copy MainPos/MainSize into them.\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                        ,0x1ee8,"void ImGui::ErrorCheckNewFrameSanityChecks()");
        }
        fVar72 = (float)((ulong)uVar7 >> 0x20);
        fVar75 = (float)((ulong)uVar8 >> 0x20);
        uVar32 = -(uint)(fVar72 <= fVar75);
        if ((uVar32 & 1) == 0) goto LAB_0012bcbf;
        uVar7 = *(undefined8 *)((long)&(pIVar13->WorkSize).x + lVar51);
        iVar56 = -(uint)(fVar83 + (float)uVar7 <= fVar61 + fVar77);
        iVar58 = -(uint)(fVar75 + (float)((ulong)uVar7 >> 0x20) <= fVar76 + fVar72);
        auVar78._4_4_ = iVar58;
        auVar78._0_4_ = iVar56;
        auVar78._8_4_ = iVar58;
        auVar78._12_4_ = iVar58;
        auVar74._8_8_ = auVar78._8_8_;
        auVar74._4_4_ = iVar56;
        auVar74._0_4_ = iVar56;
        uVar32 = movmskpd(uVar32 & 0xffff,auVar74);
        if (((uVar32 & 1) == 0) || ((byte)((byte)uVar32 >> 1) == 0)) goto LAB_0012bcbf;
        fVar61 = *(float *)((long)&pIVar13->DpiScale + lVar51);
        if ((fVar61 == 0.0) && (!NAN(fVar61))) {
          __assert_fail("mon.DpiScale != 0.0f",
                        "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                        ,0x1ee9,"void ImGui::ErrorCheckNewFrameSanityChecks()");
        }
        lVar51 = lVar51 + 0x24;
      } while ((ulong)uVar60 * 0x24 != lVar51);
      goto LAB_00128588;
    }
  }
  else {
    if ((uVar32 >> 10 & 1) != 0) goto LAB_001283e0;
LAB_00128588:
    ctx_00->ConfigFlagsCurrFrame = (ctx_00->IO).ConfigFlags;
    if (pIVar54->SettingsLoaded == false) {
      if ((pIVar54->SettingsWindows).Buf.Size != 0) {
        __assert_fail("g.SettingsWindows.empty()",
                      "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                      ,0x2c47,"void ImGui::UpdateSettings()");
      }
      pcVar42 = (pIVar54->IO).IniFilename;
      if (pcVar42 != (char *)0x0) {
        LoadIniSettingsFromDisk(pcVar42);
      }
      pIVar54->SettingsLoaded = true;
    }
    if ((0.0 < pIVar54->SettingsDirtyTimer) &&
       (fVar61 = pIVar54->SettingsDirtyTimer - (pIVar54->IO).DeltaTime,
       pIVar54->SettingsDirtyTimer = fVar61, fVar61 <= 0.0)) {
      pcVar42 = (pIVar54->IO).IniFilename;
      if (pcVar42 == (char *)0x0) {
        (pIVar54->IO).WantSaveIniSettings = true;
      }
      else {
        SaveIniSettingsToDisk(pcVar42);
      }
      pIVar54->SettingsDirtyTimer = 0.0;
    }
    fVar61 = (ctx_00->IO).DeltaTime;
    ctx_00->Time = (double)fVar61 + ctx_00->Time;
    ctx_00->WithinFrameScope = true;
    ctx_00->FrameCount = ctx_00->FrameCount + 1;
    ctx_00->TooltipOverrideCount = 0;
    ctx_00->WindowsActiveCount = 0;
    if ((ctx_00->MenusIdSubmittedThisFrame).Capacity < 0) {
      if (GImGui != (ImGuiContext *)0x0) {
        piVar39 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar39 = *piVar39 + 1;
      }
      __dest = (uint *)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
      puVar14 = (ctx_00->MenusIdSubmittedThisFrame).Data;
      if (puVar14 != (uint *)0x0) {
        memcpy(__dest,puVar14,(long)(ctx_00->MenusIdSubmittedThisFrame).Size << 2);
        puVar14 = (ctx_00->MenusIdSubmittedThisFrame).Data;
        if ((puVar14 != (uint *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar39 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar39 = *piVar39 + -1;
        }
        (*GImAllocatorFreeFunc)(puVar14,GImAllocatorUserData);
      }
      (ctx_00->MenusIdSubmittedThisFrame).Data = __dest;
      (ctx_00->MenusIdSubmittedThisFrame).Capacity = 0;
      fVar61 = (ctx_00->IO).DeltaTime;
    }
    pIVar54 = GImGui;
    (ctx_00->MenusIdSubmittedThisFrame).Size = 0;
    iVar56 = ctx_00->FramerateSecPerFrameIdx;
    ctx_00->FramerateSecPerFrameAccum =
         (fVar61 - ctx_00->FramerateSecPerFrame[iVar56]) + ctx_00->FramerateSecPerFrameAccum;
    ctx_00->FramerateSecPerFrame[iVar56] = fVar61;
    iVar58 = iVar56 + (int)((ulong)((long)(iVar56 + 1) * -0x77777777) >> 0x20) + 1;
    ctx_00->FramerateSecPerFrameIdx = iVar56 + 1 + ((iVar58 >> 6) - (iVar58 >> 0x1f)) * -0x78;
    iVar56 = 0x77;
    if (ctx_00->FramerateSecPerFrameCount < 0x77) {
      iVar56 = ctx_00->FramerateSecPerFrameCount;
    }
    ctx_00->FramerateSecPerFrameCount = iVar56 + 1;
    uVar32 = -(uint)(0.0 < ctx_00->FramerateSecPerFrameAccum);
    (ctx_00->IO).Framerate =
         (float)(~uVar32 & 0x7f7fffff |
                (uint)(1.0 / (ctx_00->FramerateSecPerFrameAccum / (float)(iVar56 + 1))) & uVar32);
    iVar56 = (pIVar54->Viewports).Size;
    if (iVar56 < (pIVar54->PlatformIO).Viewports.Size) {
      __assert_fail("g.PlatformIO.Viewports.Size <= g.Viewports.Size",
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                    ,0x2e46,"void ImGui::UpdateViewportsNewFrame()");
    }
    uVar32 = pIVar54->ConfigFlagsCurrFrame;
    if ((uVar32 >> 10 & 1) != 0) {
      if (iVar56 < 1) goto LAB_0012bc52;
      lVar51 = 0;
      do {
        p_Var15 = (pIVar54->PlatformIO).Platform_GetWindowMinimized;
        if ((p_Var15 != (_func_bool_ImGuiViewport_ptr *)0x0) &&
           (pIVar49 = (pIVar54->Viewports).Data[lVar51], pIVar49->PlatformWindowCreated == true)) {
          bVar28 = (*p_Var15)(&pIVar49->super_ImGuiViewport);
          (pIVar49->super_ImGuiViewport).Flags =
               (uint)bVar28 << 10 | (pIVar49->super_ImGuiViewport).Flags & 0xfffffbffU;
          iVar56 = (pIVar54->Viewports).Size;
        }
        lVar51 = lVar51 + 1;
      } while (lVar51 < iVar56);
    }
    if (0 < iVar56) {
      pIVar49 = *(pIVar54->Viewports).Data;
      if ((pIVar49->super_ImGuiViewport).ID != 0x11111111) {
        __assert_fail("main_viewport->ID == IMGUI_VIEWPORT_DEFAULT_ID",
                      "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                      ,0x2e5e,"void ImGui::UpdateViewportsNewFrame()");
      }
      if (pIVar49->Window != (ImGuiWindow *)0x0) {
        __assert_fail("main_viewport->Window == __null",
                      "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                      ,0x2e5f,"void ImGui::UpdateViewportsNewFrame()");
      }
      if ((uVar32 >> 10 & 1) == 0) {
        local_58._0_4_ = 0.0;
        local_58._4_4_ = 0.0;
        local_40 = (pIVar54->IO).DisplaySize;
      }
      else {
        local_58._0_8_ =
             (*(pIVar54->PlatformIO).Platform_GetWindowPos)(&pIVar49->super_ImGuiViewport);
        local_40 = (pIVar54->IO).DisplaySize;
        if (((pIVar49->super_ImGuiViewport).Flags & 0x400) != 0) {
          local_58._0_8_ = (pIVar49->super_ImGuiViewport).Pos;
          local_40 = (pIVar49->super_ImGuiViewport).Size;
        }
      }
      uVar50 = 0;
      AddUpdateViewport((ImGuiWindow *)0x0,0x11111111,(ImVec2 *)local_58,&local_40,0x1004);
      pIVar54->CurrentDpiScale = 0.0;
      pIVar54->CurrentViewport = (ImGuiViewportP *)0x0;
      pIVar54->MouseViewport = (ImGuiViewportP *)0x0;
      if (0 < (pIVar54->Viewports).Size) {
        do {
          iVar56 = (int)uVar50;
          if (iVar56 < 0) goto LAB_0012bc52;
          pIVar44 = (pIVar54->Viewports).Data[uVar50];
          *(int *)&(pIVar44->super_ImGuiViewport).field_0x5c = iVar56;
          pIVar47 = GImGui;
          if ((iVar56 == 0) || (pIVar54->FrameCount + -2 <= pIVar44->LastFrameActive)) {
            bVar28 = pIVar44->PlatformWindowCreated;
            if (((uVar32 >> 10 & 1) != 0) &&
               ((((pIVar44->super_ImGuiViewport).Flags & 0x400) == 0 & bVar28) == 1)) {
              if ((pIVar44->super_ImGuiViewport).PlatformRequestMove == true) {
                IVar62 = (*(pIVar54->PlatformIO).Platform_GetWindowPos)
                                   (&pIVar44->super_ImGuiViewport);
                pIVar44->LastPlatformPos = IVar62;
                (pIVar44->super_ImGuiViewport).Pos = IVar62;
              }
              if ((pIVar44->super_ImGuiViewport).PlatformRequestResize == true) {
                IVar62 = (*(pIVar54->PlatformIO).Platform_GetWindowSize)
                                   (&pIVar44->super_ImGuiViewport);
                pIVar44->LastPlatformSize = IVar62;
                (pIVar44->super_ImGuiViewport).Size = IVar62;
              }
            }
            UpdateViewportPlatformMonitor(pIVar44);
            IVar64 = pIVar44->BuildWorkOffsetMin;
            pIVar44->WorkOffsetMin = IVar64;
            IVar66 = pIVar44->BuildWorkOffsetMax;
            pIVar44->WorkOffsetMax = IVar66;
            (pIVar44->BuildWorkOffsetMin).x = 0.0;
            (pIVar44->BuildWorkOffsetMin).y = 0.0;
            (pIVar44->BuildWorkOffsetMax).x = 0.0;
            (pIVar44->BuildWorkOffsetMax).y = 0.0;
            IVar62 = (pIVar44->super_ImGuiViewport).Pos;
            IVar63 = (pIVar44->super_ImGuiViewport).Size;
            fVar61 = IVar62.x;
            fVar82 = fVar61 + IVar64.x;
            fVar77 = IVar62.y;
            fVar85 = fVar77 + IVar64.y;
            fVar76 = IVar66.x + (IVar63.x - IVar64.x);
            fVar83 = IVar66.y + (IVar63.y - IVar64.y);
            (pIVar44->super_ImGuiViewport).WorkPos.x = fVar82;
            (pIVar44->super_ImGuiViewport).WorkPos.y = fVar85;
            (pIVar44->super_ImGuiViewport).WorkSize.x =
                 (float)(-(uint)(0.0 < fVar76) & (uint)fVar76);
            (pIVar44->super_ImGuiViewport).WorkSize.y =
                 (float)(-(uint)(0.0 < fVar83) & (uint)fVar83);
            pIVar44->Alpha = 1.0;
            if (((pIVar44->super_ImGuiViewport).Flags & 0x1000) != 0) {
              IVar62 = pIVar44->LastPos;
              iVar58 = -(uint)(fVar61 - IVar62.x != 0.0);
              iVar59 = -(uint)(fVar77 - IVar62.y != 0.0);
              auVar68._4_4_ = iVar59;
              auVar68._0_4_ = iVar58;
              auVar68._8_4_ = iVar59;
              auVar68._12_4_ = iVar59;
              auVar67._8_8_ = auVar68._8_8_;
              auVar67._4_4_ = iVar58;
              auVar67._0_4_ = iVar58;
              iVar58 = movmskpd(IVar66.x,auVar67);
              if (iVar58 != 0) {
                TranslateWindowsInViewport
                          (pIVar44,&pIVar44->LastPos,&(pIVar44->super_ImGuiViewport).Pos);
              }
            }
            p_Var18 = (pIVar54->PlatformIO).Platform_GetWindowDpiScale;
            if ((p_Var18 == (_func_float_ImGuiViewport_ptr *)0x0) || (bVar28 == false)) {
              uVar60 = (uint)pIVar44->PlatformMonitor;
              if (uVar60 == 0xffffffff) {
                fVar61 = (pIVar44->super_ImGuiViewport).DpiScale;
                uVar60 = -(uint)(fVar61 != 0.0);
                fVar61 = (float)(~uVar60 & 0x3f800000 | (uint)fVar61 & uVar60);
              }
              else {
                if ((pIVar44->PlatformMonitor < 0) ||
                   ((pIVar54->PlatformIO).Monitors.Size <= (int)uVar60)) {
                  pcVar42 = 
                  "T &ImVector<ImGuiPlatformMonitor>::operator[](int) [T = ImGuiPlatformMonitor]";
                  goto LAB_0012bd48;
                }
                fVar61 = (pIVar54->PlatformIO).Monitors.Data[uVar60].DpiScale;
              }
            }
            else {
              fVar61 = (*p_Var18)(&pIVar44->super_ImGuiViewport);
            }
            fVar76 = (pIVar44->super_ImGuiViewport).DpiScale;
            if ((fVar76 != 0.0) || (NAN(fVar76))) {
              if (((fVar61 != fVar76) || (NAN(fVar61) || NAN(fVar76))) &&
                 (((pIVar54->IO).ConfigFlags & 0x4000) != 0)) {
                ScaleWindowsInViewport(pIVar44,fVar61 / fVar76);
              }
            }
            (pIVar44->super_ImGuiViewport).DpiScale = fVar61;
            uVar50 = (ulong)(iVar56 + 1);
          }
          else {
            lVar51 = (long)(GImGui->Windows).Size;
            if (0 < lVar51) {
              ppIVar16 = (GImGui->Windows).Data;
              lVar53 = 0;
              do {
                pIVar37 = ppIVar16[lVar53];
                if (pIVar37->Viewport == pIVar44) {
                  pIVar37->Viewport = (ImGuiViewportP *)0x0;
                  pIVar37->ViewportOwned = false;
                }
                lVar53 = lVar53 + 1;
              } while (lVar51 != lVar53);
            }
            if (pIVar47->MouseLastHoveredViewport == pIVar44) {
              pIVar47->MouseLastHoveredViewport = (ImGuiViewportP *)0x0;
            }
            DestroyPlatformWindow(pIVar44);
            ppIVar17 = (pIVar47->PlatformIO).Viewports.Data;
            ppIVar35 = ppIVar17;
            while (ppIVar35 < ppIVar17 + (pIVar47->PlatformIO).Viewports.Size) {
              pIVar36 = (ImGuiViewportP *)*ppIVar35;
              ppIVar35 = ppIVar35 + 1;
              if (pIVar36 == pIVar44) {
                __assert_fail("g.PlatformIO.Viewports.contains(viewport) == false",
                              "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                              ,0x2f5a,"void ImGui::DestroyViewport(ImGuiViewportP *)");
              }
            }
            iVar56 = *(int *)&(pIVar44->super_ImGuiViewport).field_0x5c;
            uVar43 = (ulong)iVar56;
            if (((long)uVar43 < 0) || (iVar58 = (pIVar47->Viewports).Size, iVar58 <= iVar56))
            goto LAB_0012bc52;
            ppIVar19 = (pIVar47->Viewports).Data;
            if (ppIVar19[uVar43] != pIVar44) {
              __assert_fail("g.Viewports[viewport->Idx] == viewport",
                            "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                            ,0x2f5b,"void ImGui::DestroyViewport(ImGuiViewportP *)");
            }
            ppIVar19 = ppIVar19 + uVar43;
            memmove(ppIVar19,ppIVar19 + 1,(~uVar43 + (long)iVar58) * 8);
            (pIVar47->Viewports).Size = (pIVar47->Viewports).Size + -1;
            IM_DELETE<ImGuiViewportP>(pIVar44);
          }
          iVar56 = (pIVar54->Viewports).Size;
        } while ((int)uVar50 < iVar56);
        uVar50 = (ulong)(0 < iVar56);
      }
      if ((pIVar54->PlatformIO).Monitors.Size == 0) {
        (pIVar54->FallbackMonitor).MainPos = (pIVar49->super_ImGuiViewport).Pos;
        (pIVar54->FallbackMonitor).MainSize = (pIVar49->super_ImGuiViewport).Size;
        (pIVar54->FallbackMonitor).WorkPos = (pIVar49->super_ImGuiViewport).WorkPos;
        (pIVar54->FallbackMonitor).WorkSize = (pIVar49->super_ImGuiViewport).WorkSize;
        (pIVar54->FallbackMonitor).DpiScale = (pIVar49->super_ImGuiViewport).DpiScale;
      }
      if ((uVar32 >> 10 & 1) == 0) {
LAB_00128c11:
        pIVar54->MouseViewport = pIVar49;
      }
      else {
        if (((pIVar54->IO).BackendFlags & 0x800) == 0) {
          lVar51 = (long)(GImGui->Viewports).Size;
          if (lVar51 < 1) goto LAB_00128cef;
          IVar62 = (pIVar54->IO).MousePos;
          fVar61 = IVar62.x;
          fVar76 = IVar62.y;
          lVar53 = 0;
          pIVar44 = (ImGuiViewportP *)0x0;
          do {
            pIVar49 = (GImGui->Viewports).Data[lVar53];
            if (((((((pIVar49->super_ImGuiViewport).Flags & 0x480) == 0) &&
                  (fVar83 = (pIVar49->super_ImGuiViewport).Pos.x, fVar83 <= fVar61)) &&
                 (fVar77 = (pIVar49->super_ImGuiViewport).Pos.y, fVar77 <= fVar76)) &&
                ((fVar61 < fVar83 + (pIVar49->super_ImGuiViewport).Size.x &&
                 (fVar76 < fVar77 + (pIVar49->super_ImGuiViewport).Size.y)))) &&
               ((pIVar44 == (ImGuiViewportP *)0x0 ||
                (pIVar44->LastFrontMostStampCount < pIVar49->LastFrontMostStampCount)))) {
              pIVar44 = pIVar49;
            }
            lVar53 = lVar53 + 1;
          } while (lVar51 != lVar53);
          if (pIVar44 == (ImGuiViewportP *)0x0) goto LAB_00128cef;
LAB_00128d29:
          pIVar54->MouseLastHoveredViewport = pIVar44;
          bVar28 = false;
          pIVar49 = pIVar44;
        }
        else {
          IVar40 = (pIVar54->IO).MouseHoveredViewport;
          if ((IVar40 != 0) && (lVar51 = (long)(GImGui->Viewports).Size, 0 < lVar51)) {
            lVar53 = 0;
            do {
              pIVar44 = (GImGui->Viewports).Data[lVar53];
              if ((pIVar44->super_ImGuiViewport).ID == IVar40) {
                if (((pIVar44->super_ImGuiViewport).Flags & 0x80) != 0) {
                  __assert_fail("0",
                                "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                                ,0x2ecd,"void ImGui::UpdateViewportsNewFrame()");
                }
                goto LAB_00128d29;
              }
              lVar53 = lVar53 + 1;
            } while (lVar51 != lVar53);
          }
LAB_00128cef:
          pIVar49 = pIVar54->MouseLastHoveredViewport;
          bVar28 = true;
          if (pIVar49 == (ImGuiViewportP *)0x0) {
            if ((char)uVar50 == '\0') goto LAB_0012bc52;
            pIVar49 = *(pIVar54->Viewports).Data;
            pIVar54->MouseLastHoveredViewport = pIVar49;
          }
          pIVar44 = (ImGuiViewportP *)0x0;
        }
        if ((pIVar54->MovingWindow == (ImGuiWindow *)0x0) ||
           (pIVar36 = pIVar54->MovingWindow->Viewport, pIVar36 == (ImGuiViewportP *)0x0)) {
          pIVar36 = pIVar49;
        }
        if (pIVar54->DragDropActive == false) {
          pIVar49 = pIVar44;
        }
        if (!bVar28) {
          pIVar49 = pIVar44;
        }
        pIVar54->MouseViewport = pIVar36;
        if ((pIVar54->DragDropActive == false) && (pIVar54->ActiveId != 0)) {
          if ((GImGui->IO).MouseDown[0] == false) {
            uVar50 = 0;
            do {
              uVar43 = uVar50;
              if (uVar43 == 4) break;
              uVar50 = uVar43 + 1;
            } while ((GImGui->IO).MouseDown[uVar43 + 1] != true);
            if (3 < uVar43) goto LAB_00128dab;
          }
        }
        else {
LAB_00128dab:
          if (((pIVar49 != (ImGuiViewportP *)0x0) && (pIVar49 != pIVar36)) &&
             (((pIVar49->super_ImGuiViewport).Flags & 0x80) == 0)) goto LAB_00128c11;
        }
        if (pIVar36 == (ImGuiViewportP *)0x0) {
          __assert_fail("g.MouseViewport != __null",
                        "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                        ,0x2ef1,"void ImGui::UpdateViewportsNewFrame()");
        }
      }
      ((ctx_00->IO).Fonts)->Locked = true;
      font = (GImGui->IO).FontDefault;
      if (font == (ImFont *)0x0) {
        pIVar12 = (GImGui->IO).Fonts;
        if ((pIVar12->Fonts).Size < 1) {
          pcVar42 = "T &ImVector<ImFont *>::operator[](int) [T = ImFont *]";
          goto LAB_0012bd48;
        }
        font = *(pIVar12->Fonts).Data;
      }
      SetCurrentFont(font);
      if (ctx_00->Font->ContainerAtlas == (ImFontAtlas *)0x0) {
        __assert_fail("g.Font->IsLoaded()",
                      "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                      ,0x102a,"void ImGui::NewFrame()");
      }
      lVar51 = (long)(ctx_00->Viewports).Size;
      if (lVar51 < 1) {
        fVar61 = 3.4028235e+38;
        fVar76 = 3.4028235e+38;
        fVar83 = -3.4028235e+38;
        fVar77 = -3.4028235e+38;
      }
      else {
        fVar61 = 3.4028235e+38;
        fVar76 = 3.4028235e+38;
        fVar83 = -3.4028235e+38;
        fVar77 = -3.4028235e+38;
        lVar53 = 0;
        do {
          pIVar49 = (ctx_00->Viewports).Data[lVar53];
          fVar75 = (pIVar49->super_ImGuiViewport).Pos.x;
          if (fVar75 < fVar61) {
            fVar61 = fVar75;
          }
          fVar72 = (pIVar49->super_ImGuiViewport).Pos.y;
          if (fVar72 < fVar76) {
            fVar76 = fVar72;
          }
          fVar75 = fVar75 + (pIVar49->super_ImGuiViewport).Size.x;
          if (fVar83 < fVar75) {
            fVar83 = fVar75;
          }
          fVar72 = fVar72 + (pIVar49->super_ImGuiViewport).Size.y;
          if (fVar77 < fVar72) {
            fVar77 = fVar72;
          }
          lVar53 = lVar53 + 1;
        } while (lVar51 != lVar53);
      }
      (ctx_00->DrawListSharedData).ClipRectFullscreen.x = fVar61;
      (ctx_00->DrawListSharedData).ClipRectFullscreen.y = fVar76;
      (ctx_00->DrawListSharedData).ClipRectFullscreen.z = fVar83;
      (ctx_00->DrawListSharedData).ClipRectFullscreen.w = fVar77;
      fVar61 = (ctx_00->Style).CircleTessellationMaxError;
      (ctx_00->DrawListSharedData).CurveTessellationTol = (ctx_00->Style).CurveTessellationTol;
      ImDrawListSharedData::SetCircleTessellationMaxError(&ctx_00->DrawListSharedData,fVar61);
      bVar28 = (ctx_00->Style).AntiAliasedLines;
      uVar32 = (uint)bVar28;
      (ctx_00->DrawListSharedData).InitialFlags = (uint)bVar28;
      if (((ctx_00->Style).AntiAliasedLinesUseTex != false) &&
         ((ctx_00->Font->ContainerAtlas->Flags & 4) == 0)) {
        uVar32 = bVar28 | 2;
        (ctx_00->DrawListSharedData).InitialFlags = uVar32;
      }
      if ((ctx_00->Style).AntiAliasedFill == true) {
        uVar32 = uVar32 | 4;
        (ctx_00->DrawListSharedData).InitialFlags = uVar32;
      }
      if (((ctx_00->IO).BackendFlags & 8) != 0) {
        (ctx_00->DrawListSharedData).InitialFlags = uVar32 | 8;
      }
      if (0 < (ctx_00->Viewports).Size) {
        lVar51 = 0;
        do {
          pIVar49 = (ctx_00->Viewports).Data[lVar51];
          (pIVar49->super_ImGuiViewport).DrawData = (ImDrawData *)0x0;
          (pIVar49->DrawDataP).Valid = false;
          *(undefined3 *)&(pIVar49->DrawDataP).field_0x1 = 0;
          (pIVar49->DrawDataP).CmdListsCount = 0;
          (pIVar49->DrawDataP).TotalIdxCount = 0;
          (pIVar49->DrawDataP).TotalVtxCount = 0;
          (pIVar49->DrawDataP).CmdLists = (ImDrawList **)0x0;
          (pIVar49->DrawDataP).DisplayPos.x = 0.0;
          (pIVar49->DrawDataP).DisplayPos.y = 0.0;
          (pIVar49->DrawDataP).DisplaySize.x = 0.0;
          (pIVar49->DrawDataP).DisplaySize.y = 0.0;
          (pIVar49->DrawDataP).FramebufferScale.x = 0.0;
          (pIVar49->DrawDataP).FramebufferScale.y = 0.0;
          (pIVar49->DrawDataP).OwnerViewport = (ImGuiViewport *)0x0;
          lVar51 = lVar51 + 1;
        } while (lVar51 < (ctx_00->Viewports).Size);
      }
      pIVar54 = GImGui;
      if ((ctx_00->DragDropActive != false) &&
         (IVar40 = (ctx_00->DragDropPayload).SourceId, IVar40 == ctx_00->ActiveId)) {
        if (GImGui->ActiveId == IVar40) {
          GImGui->ActiveIdIsAlive = IVar40;
        }
        if (pIVar54->ActiveIdPreviousFrame == IVar40) {
          pIVar54->ActiveIdPreviousFrameIsAlive = true;
        }
      }
      if (ctx_00->HoveredIdPreviousFrame == 0) {
        IVar40 = ctx_00->HoveredId;
        ctx_00->HoveredIdTimer = 0.0;
        ctx_00->HoveredIdNotActiveTimer = 0.0;
        if (IVar40 == 0) goto LAB_00129008;
LAB_00128fe1:
        fVar61 = (ctx_00->IO).DeltaTime;
        ctx_00->HoveredIdTimer = ctx_00->HoveredIdTimer + fVar61;
        IVar33 = IVar40;
        if (ctx_00->ActiveId != IVar40) {
          ctx_00->HoveredIdNotActiveTimer = fVar61 + ctx_00->HoveredIdNotActiveTimer;
          IVar33 = ctx_00->ActiveId;
        }
      }
      else {
        IVar40 = ctx_00->HoveredId;
        if (IVar40 != 0) {
          if (ctx_00->ActiveId == IVar40) {
            ctx_00->HoveredIdNotActiveTimer = 0.0;
          }
          goto LAB_00128fe1;
        }
LAB_00129008:
        IVar40 = 0;
        IVar33 = ctx_00->ActiveId;
      }
      ctx_00->HoveredIdPreviousFrame = IVar40;
      ctx_00->HoveredIdPreviousFrameUsingMouseWheel = ctx_00->HoveredIdUsingMouseWheel;
      ctx_00->HoveredId = 0;
      ctx_00->HoveredIdAllowOverlap = false;
      ctx_00->HoveredIdUsingMouseWheel = false;
      ctx_00->HoveredIdDisabled = false;
      if (((ctx_00->ActiveIdIsAlive != IVar33) && (IVar33 != 0)) &&
         (ctx_00->ActiveIdPreviousFrame == IVar33)) {
        SetActiveID(0,(ImGuiWindow *)0x0);
        IVar33 = ctx_00->ActiveId;
      }
      fVar61 = (ctx_00->IO).DeltaTime;
      if (IVar33 != 0) {
        ctx_00->ActiveIdTimer = ctx_00->ActiveIdTimer + fVar61;
      }
      ctx_00->LastActiveIdTimer = ctx_00->LastActiveIdTimer + fVar61;
      ctx_00->ActiveIdPreviousFrame = IVar33;
      ctx_00->ActiveIdPreviousFrameWindow = ctx_00->ActiveIdWindow;
      ctx_00->ActiveIdPreviousFrameHasBeenEditedBefore = ctx_00->ActiveIdHasBeenEditedBefore;
      ctx_00->ActiveIdIsAlive = 0;
      ctx_00->ActiveIdHasBeenEditedThisFrame = false;
      ctx_00->ActiveIdPreviousFrameIsAlive = false;
      ctx_00->ActiveIdIsJustActivated = false;
      if (ctx_00->TempInputId == 0) {
LAB_001290f8:
        if (IVar33 == 0) {
          ctx_00->ActiveIdUsingNavDirMask = 0;
          ctx_00->ActiveIdUsingNavInputMask = 0;
          ctx_00->ActiveIdUsingKeyInputMask = 0;
        }
      }
      else if (IVar33 != ctx_00->TempInputId) {
        ctx_00->TempInputId = 0;
        goto LAB_001290f8;
      }
      ctx_00->DragDropAcceptIdPrev = ctx_00->DragDropAcceptIdCurr;
      ctx_00->DragDropAcceptIdCurrRectSurface = 3.4028235e+38;
      ctx_00->DragDropAcceptIdCurr = 0;
      ctx_00->DragDropWithinSource = false;
      ctx_00->DragDropWithinTarget = false;
      ctx_00->DragDropHoldJustPressedId = 0;
      if ((ctx_00->IO).AppFocusLost == true) {
        memset((ctx_00->IO).KeysDown,0,0x200);
        lVar51 = -0x200;
        do {
          pfVar5 = (ctx_00->IO).NavInputsDownDuration + lVar51;
          pfVar5[0] = -1.0;
          pfVar5[1] = -1.0;
          pfVar5[2] = -1.0;
          pfVar5[3] = -1.0;
          pfVar5 = (ctx_00->IO).KeysDownDurationPrev + lVar51;
          pfVar5[0] = -1.0;
          pfVar5[1] = -1.0;
          pfVar5[2] = -1.0;
          pfVar5[3] = -1.0;
          lVar51 = lVar51 + 4;
        } while (lVar51 != 0);
        (ctx_00->IO).KeyMods = 0;
        (ctx_00->IO).KeyModsPrev = 0;
        (ctx_00->IO).KeyCtrl = false;
        (ctx_00->IO).KeyShift = false;
        (ctx_00->IO).KeyAlt = false;
        (ctx_00->IO).KeySuper = false;
        lVar51 = -0x14;
        do {
          pfVar5 = (ctx_00->IO).NavInputsDownDurationPrev + lVar51 + 0x14;
          pfVar5[0] = -1.0;
          pfVar5[1] = -1.0;
          pfVar5[2] = -1.0;
          pfVar5[3] = -1.0;
          pfVar5 = (ctx_00->IO).NavInputsDownDurationPrev + lVar51;
          pfVar5[0] = -1.0;
          pfVar5[1] = -1.0;
          pfVar5[2] = -1.0;
          pfVar5[3] = -1.0;
          lVar51 = lVar51 + 4;
        } while (lVar51 != 0);
        (ctx_00->IO).AppFocusLost = false;
      }
      pIVar54 = GImGui;
      bVar28 = (GImGui->IO).KeyCtrl;
      uVar32 = bVar28 + 2;
      if ((GImGui->IO).KeyShift == false) {
        uVar32 = (uint)bVar28;
      }
      uVar60 = uVar32 + 4;
      if ((GImGui->IO).KeyAlt == false) {
        uVar60 = uVar32;
      }
      uVar32 = uVar60 + 8;
      if ((GImGui->IO).KeySuper == false) {
        uVar32 = uVar60;
      }
      (ctx_00->IO).KeyMods = uVar32;
      memcpy((ctx_00->IO).KeysDownDurationPrev,(ctx_00->IO).KeysDownDuration,0x800);
      lVar51 = 0x140;
      do {
        fVar76 = -1.0;
        if (*(char *)((long)(ctx_00->IO).KeyMap + lVar51 + -0x3c) == '\x01') {
          fVar83 = *(float *)((long)ctx_00 + lVar51 * 4 + -0x5c);
          fVar76 = 0.0;
          if (0.0 <= fVar83) {
            fVar76 = fVar83 + fVar61;
          }
        }
        *(float *)((long)ctx_00 + lVar51 * 4 + -0x5c) = fVar76;
        lVar51 = lVar51 + 1;
      } while (lVar51 != 0x340);
      (pIVar54->IO).WantSetMousePos = false;
      uVar32 = (pIVar54->IO).ConfigFlags;
      if (((uVar32 & 2) == 0) || (((pIVar54->IO).BackendFlags & 1) == 0)) {
        bVar28 = false;
      }
      else {
        bVar28 = true;
        if ((pIVar54->NavInputSource != ImGuiInputSource_Gamepad) &&
           (((0.0 < (pIVar54->IO).NavInputs[0] || (0.0 < (pIVar54->IO).NavInputs[2])) ||
            ((0.0 < (pIVar54->IO).NavInputs[1] ||
             ((((0.0 < (pIVar54->IO).NavInputs[3] || (0.0 < (pIVar54->IO).NavInputs[4])) ||
               (0.0 < (pIVar54->IO).NavInputs[5])) ||
              ((0.0 < (pIVar54->IO).NavInputs[6] || (0.0 < (pIVar54->IO).NavInputs[7])))))))))) {
          pIVar54->NavInputSource = ImGuiInputSource_Gamepad;
        }
      }
      if ((uVar32 & 1) != 0) {
        uVar60 = (pIVar54->IO).KeyMap[0xc];
        if (-1 < (long)(int)uVar60) {
          if (0x1ff < uVar60) goto LAB_0012bd52;
          if ((pIVar54->IO).KeysDown[(int)uVar60] == true) {
            (pIVar54->IO).NavInputs[0] = 1.0;
            pIVar54->NavInputSource = ImGuiInputSource_Keyboard;
          }
        }
        uVar60 = (pIVar54->IO).KeyMap[0xd];
        if (-1 < (long)(int)uVar60) {
          if (0x1ff < uVar60) goto LAB_0012bd52;
          if ((pIVar54->IO).KeysDown[(int)uVar60] == true) {
            (pIVar54->IO).NavInputs[2] = 1.0;
            pIVar54->NavInputSource = ImGuiInputSource_Keyboard;
          }
        }
        uVar60 = (pIVar54->IO).KeyMap[0xe];
        if (-1 < (long)(int)uVar60) {
          if (0x1ff < uVar60) goto LAB_0012bd52;
          if ((pIVar54->IO).KeysDown[(int)uVar60] == true) {
            (pIVar54->IO).NavInputs[1] = 1.0;
            pIVar54->NavInputSource = ImGuiInputSource_Keyboard;
          }
        }
        uVar60 = (pIVar54->IO).KeyMap[1];
        if (-1 < (long)(int)uVar60) {
          if (0x1ff < uVar60) goto LAB_0012bd52;
          if ((pIVar54->IO).KeysDown[(int)uVar60] == true) {
            (pIVar54->IO).NavInputs[0x10] = 1.0;
            pIVar54->NavInputSource = ImGuiInputSource_Keyboard;
          }
        }
        uVar60 = (pIVar54->IO).KeyMap[2];
        if (-1 < (long)(int)uVar60) {
          if (0x1ff < uVar60) goto LAB_0012bd52;
          if ((pIVar54->IO).KeysDown[(int)uVar60] == true) {
            (pIVar54->IO).NavInputs[0x11] = 1.0;
            pIVar54->NavInputSource = ImGuiInputSource_Keyboard;
          }
        }
        uVar60 = (pIVar54->IO).KeyMap[3];
        if (-1 < (long)(int)uVar60) {
          if (0x1ff < uVar60) goto LAB_0012bd52;
          if ((pIVar54->IO).KeysDown[(int)uVar60] == true) {
            (pIVar54->IO).NavInputs[0x12] = 1.0;
            pIVar54->NavInputSource = ImGuiInputSource_Keyboard;
          }
        }
        uVar60 = (pIVar54->IO).KeyMap[4];
        if (-1 < (long)(int)uVar60) {
          if (0x1ff < uVar60) goto LAB_0012bd52;
          if ((pIVar54->IO).KeysDown[(int)uVar60] == true) {
            (pIVar54->IO).NavInputs[0x13] = 1.0;
            pIVar54->NavInputSource = ImGuiInputSource_Keyboard;
          }
        }
        if ((pIVar54->IO).KeyCtrl == true) {
          (pIVar54->IO).NavInputs[0xe] = 1.0;
        }
        if ((pIVar54->IO).KeyShift == true) {
          (pIVar54->IO).NavInputs[0xf] = 1.0;
        }
      }
      pfVar5 = (pIVar54->IO).NavInputsDownDuration;
      pIVar47 = (ImGuiContext *)pfVar5;
      pfVar48 = (pIVar54->IO).NavInputsDownDurationPrev;
      for (lVar51 = 0x14; lVar51 != 0; lVar51 = lVar51 + -1) {
        *pfVar48 = *(float *)pIVar47;
        pIVar47 = (ImGuiContext *)((long)pIVar47 + (ulong)bVar55 * -8 + 4);
        pfVar48 = pfVar48 + (ulong)bVar55 * -2 + 1;
      }
      lVar51 = 0;
      do {
        fVar61 = -1.0;
        if (0.0 < (pIVar54->IO).NavInputs[lVar51]) {
          fVar61 = 0.0;
          if (0.0 <= pfVar5[lVar51]) {
            fVar61 = pfVar5[lVar51] + (pIVar54->IO).DeltaTime;
          }
        }
        pfVar5[lVar51] = fVar61;
        lVar51 = lVar51 + 1;
      } while (lVar51 != 0x14);
      if (pIVar54->NavInitResultId != 0) {
        NavInitRequestApplyResult();
      }
      pIVar54->NavInitRequest = false;
      pIVar54->NavInitRequestFromMove = false;
      pIVar54->NavInitResultId = 0;
      pIVar54->NavJustMovedToId = 0;
      if (pIVar54->NavMoveSubmitted == true) {
        NavMoveRequestApplyResult();
      }
      pIVar54->NavTabbingInputableRemaining = 0;
      pIVar54->NavMoveSubmitted = false;
      pIVar54->NavMoveScoringItems = false;
      if ((pIVar54->NavMousePosDirty == true) && (pIVar54->NavIdIsAlive == true)) {
        if (((((pIVar54->IO).ConfigFlags & 4) != 0) &&
            (((((pIVar54->IO).BackendFlags & 4) != 0 && (pIVar54->NavDisableHighlight == false)) &&
             (pIVar54->NavDisableMouseHover == true)))) &&
           (pIVar54->NavWindow != (ImGuiWindow *)0x0)) {
          IVar62 = NavCalcPreferredRefPos();
          (pIVar54->IO).MousePosPrev = IVar62;
          (pIVar54->IO).MousePos = IVar62;
          (pIVar54->IO).WantSetMousePos = true;
        }
        pIVar54->NavMousePosDirty = false;
      }
      pIVar54->NavIdIsAlive = false;
      pIVar54->NavJustTabbedId = 0;
      IVar9 = pIVar54->NavLayer;
      if (ImGuiNavLayer_Menu < IVar9) {
        __assert_fail("g.NavLayer == ImGuiNavLayer_Main || g.NavLayer == ImGuiNavLayer_Menu",
                      "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                      ,0x2706,"void ImGui::NavUpdate()");
      }
      pIVar37 = pIVar54->NavWindow;
      pIVar45 = pIVar37;
      if (pIVar37 != (ImGuiWindow *)0x0) {
        do {
          if ((pIVar45->RootWindow == pIVar45) || ((pIVar45->Flags & 0x14000000) != 0)) {
            if (pIVar45 != pIVar37) {
              pIVar45->NavLastChildNavWindow = pIVar37;
            }
            break;
          }
          ppIVar16 = &pIVar45->ParentWindow;
          pIVar45 = *ppIVar16;
        } while (*ppIVar16 != (ImGuiWindow *)0x0);
        if ((IVar9 == ImGuiNavLayer_Main) && (pIVar37->NavLastChildNavWindow != (ImGuiWindow *)0x0))
        {
          pIVar37->NavLastChildNavWindow = (ImGuiWindow *)0x0;
        }
      }
      pIVar27 = GImGui;
      pIVar37 = GetTopMostPopupModal();
      if (pIVar37 != (ImGuiWindow *)0x0) {
        pIVar27->NavWindowingTarget = (ImGuiWindow *)0x0;
      }
      if ((pIVar27->NavWindowingTargetAnim != (ImGuiWindow *)0x0) &&
         (pIVar27->NavWindowingTarget == (ImGuiWindow *)0x0)) {
        fVar61 = (pIVar27->IO).DeltaTime * -10.0 + pIVar27->NavWindowingHighlightAlpha;
        fVar61 = (float)(-(uint)(0.0 <= fVar61) & (uint)fVar61);
        pIVar27->NavWindowingHighlightAlpha = fVar61;
        if ((pIVar27->DimBgRatio <= 0.0) && (fVar61 <= 0.0)) {
          pIVar27->NavWindowingTargetAnim = (ImGuiWindow *)0x0;
        }
      }
      uVar60 = (pIVar27->IO).ConfigFlags;
      if ((pIVar37 == (ImGuiWindow *)0x0) && (pIVar27->NavWindowingTarget == (ImGuiWindow *)0x0)) {
        bVar29 = (bool)(-((pIVar27->IO).NavInputsDownDuration[3] == 0.0) & 1);
        if ((((uVar60 & 1) == 0) || ((pIVar27->IO).KeyCtrl != true)) ||
           (iVar56 = (pIVar27->IO).KeyMap[0], iVar56 < 0)) goto LAB_00129662;
        pIVar47 = (ImGuiContext *)0x1;
        bVar30 = IsKeyPressed(iVar56,true);
      }
      else {
        bVar29 = false;
LAB_00129662:
        bVar30 = false;
      }
      if ((bVar29 | bVar30) == 1) {
        pIVar37 = pIVar27->NavWindow;
        if (pIVar37 == (ImGuiWindow *)0x0) {
          pIVar47 = (ImGuiContext *)0x80000001;
          pIVar37 = FindWindowNavFocusable((pIVar27->WindowsFocusOrder).Size + -1,-0x7fffffff,-1);
          if (pIVar37 == (ImGuiWindow *)0x0) goto LAB_001296cc;
        }
        pIVar37 = pIVar37->RootWindow;
        pIVar27->NavWindowingTargetAnim = pIVar37;
        pIVar27->NavWindowingTarget = pIVar37;
        pIVar27->NavWindowingTimer = 0.0;
        pIVar27->NavWindowingHighlightAlpha = 0.0;
        pIVar27->NavWindowingToggleLayer = bVar29;
        pIVar27->NavInputSource = bVar30 ^ ImGuiInputSource_Gamepad;
      }
LAB_001296cc:
      fVar61 = (pIVar27->IO).DeltaTime + pIVar27->NavWindowingTimer;
      pIVar27->NavWindowingTimer = fVar61;
      if (pIVar27->NavWindowingTarget == (ImGuiWindow *)0x0) {
LAB_00129970:
        bVar29 = false;
        pIVar37 = (ImGuiWindow *)0x0;
      }
      else {
        IVar34 = pIVar27->NavInputSource;
        if (IVar34 != ImGuiInputSource_Gamepad) {
LAB_001298d5:
          if (IVar34 == ImGuiInputSource_Keyboard) {
            fVar76 = (pIVar27->NavWindowingTimer + -0.2) / 0.05;
            fVar61 = 1.0;
            if (fVar76 <= 1.0) {
              fVar61 = fVar76;
            }
            fVar61 = (float)(~-(uint)(fVar76 < 0.0) & (uint)fVar61);
            uVar57 = -(uint)(fVar61 <= pIVar27->NavWindowingHighlightAlpha);
            pIVar27->NavWindowingHighlightAlpha =
                 (float)(uVar57 & (uint)pIVar27->NavWindowingHighlightAlpha | ~uVar57 & (uint)fVar61
                        );
            iVar56 = (GImGui->IO).KeyMap[0];
            if (-1 < iVar56) {
              pIVar47 = (ImGuiContext *)0x1;
              bVar29 = IsKeyPressed(iVar56,true);
              if (bVar29) {
                NavUpdateWindowingHighlightWindow((pIVar27->IO).KeyShift - 1 | 1);
              }
            }
            if ((pIVar27->IO).KeyCtrl == false) {
              pIVar37 = pIVar27->NavWindowingTarget;
              bVar29 = false;
              goto LAB_00129975;
            }
          }
          goto LAB_00129970;
        }
        fVar76 = (fVar61 + -0.2) / 0.05;
        fVar61 = 1.0;
        if (fVar76 <= 1.0) {
          fVar61 = fVar76;
        }
        fVar61 = (float)(~-(uint)(fVar76 < 0.0) & (uint)fVar61);
        uVar57 = -(uint)(fVar61 <= pIVar27->NavWindowingHighlightAlpha);
        fVar83 = (float)(uVar57 & (uint)pIVar27->NavWindowingHighlightAlpha | ~uVar57 & (uint)fVar61
                        );
        pIVar27->NavWindowingHighlightAlpha = fVar83;
        fVar61 = GetNavInputAmount(0xc,ImGuiInputReadMode_RepeatSlow);
        pIVar47 = (ImGuiContext *)0x4;
        fVar76 = GetNavInputAmount(0xd,ImGuiInputReadMode_RepeatSlow);
        iVar56 = (uint)(0.0 < fVar61) - (uint)(0.0 < fVar76);
        if (iVar56 != 0) {
          NavUpdateWindowingHighlightWindow(iVar56);
          pIVar27->NavWindowingHighlightAlpha = 1.0;
          fVar83 = 1.0;
        }
        if (0.0 < (GImGui->IO).NavInputs[3]) {
          if (pIVar27->NavWindowingTarget == (ImGuiWindow *)0x0) goto LAB_00129970;
          IVar34 = pIVar27->NavInputSource;
          goto LAB_001298d5;
        }
        pbVar52 = &pIVar27->NavWindowingToggleLayer;
        *pbVar52 = (bool)(*pbVar52 & fVar83 < 1.0);
        if (*pbVar52 == false) {
          pIVar37 = pIVar27->NavWindowingTarget;
          bVar29 = false;
        }
        else {
          bVar29 = pIVar27->NavWindow != (ImGuiWindow *)0x0;
          pIVar37 = (ImGuiWindow *)0x0;
        }
        pIVar27->NavWindowingTarget = (ImGuiWindow *)0x0;
      }
LAB_00129975:
      if ((((uVar60 & 1) != 0) && ((pIVar27->IO).KeyMods == 4)) &&
         (((pIVar27->IO).KeyModsPrev & 4) == 0)) {
        pIVar27->NavWindowingToggleLayer = true;
        pIVar27->NavInputSource = ImGuiInputSource_Keyboard;
      }
      if ((pIVar27->NavWindowingToggleLayer == true) &&
         (pIVar27->NavInputSource == ImGuiInputSource_Keyboard)) {
        if ((0 < (pIVar27->IO).InputQueueCharacters.Size) ||
           ((((pIVar27->IO).KeyCtrl != false || ((pIVar27->IO).KeyShift != false)) ||
            (bVar30 = true, (pIVar27->IO).KeySuper == true)))) {
          pIVar27->NavWindowingToggleLayer = false;
          bVar30 = false;
        }
        if (((((pIVar27->IO).KeyMods & 4) == 0) && (((pIVar27->IO).KeyModsPrev & 4) != 0)) &&
           ((bVar30 && ((pIVar27->ActiveId == 0 || (pIVar27->ActiveIdAllowOverlap == true)))))) {
          bVar30 = IsMousePosValid(&(pIVar27->IO).MousePos);
          bVar31 = IsMousePosValid(&(pIVar27->IO).MousePosPrev);
          bVar29 = (bool)(bVar29 | bVar31 == bVar30);
        }
        if ((pIVar27->IO).KeyAlt == false) {
          pIVar27->NavWindowingToggleLayer = false;
        }
      }
      pIVar45 = pIVar27->NavWindowingTarget;
      if ((pIVar45 != (ImGuiWindow *)0x0) && ((pIVar45->Flags & 4) == 0)) {
        if (pIVar27->NavInputSource == ImGuiInputSource_Gamepad) {
          dir_sources = 4;
LAB_00129ac6:
          pIVar47 = (ImGuiContext *)0x0;
          IVar62 = GetNavInputAmount2d(dir_sources,ImGuiInputReadMode_Down,0.0,0.0);
        }
        else {
          IVar62.x = 0.0;
          IVar62.y = 0.0;
          if ((pIVar27->NavInputSource == ImGuiInputSource_Keyboard) &&
             (dir_sources = 1, (pIVar27->IO).KeyShift == false)) goto LAB_00129ac6;
        }
        fVar61 = IVar62.y;
        if (((IVar62.x != 0.0) || (fVar61 != 0.0)) || (NAN(fVar61))) {
          fVar76 = (pIVar27->IO).DisplayFramebufferScale.x;
          fVar83 = (pIVar27->IO).DisplayFramebufferScale.y;
          if (fVar83 <= fVar76) {
            fVar76 = fVar83;
          }
          fVar76 = (float)(int)(fVar76 * (pIVar27->IO).DeltaTime * 800.0);
          pIVar45 = pIVar45->RootWindowDockTree;
          local_58._0_4_ = (pIVar45->Pos).x + IVar62.x * fVar76;
          local_58._4_4_ = (pIVar45->Pos).y + fVar61 * fVar76;
          pIVar47 = (ImGuiContext *)local_58;
          SetWindowPos(pIVar45,(ImVec2 *)pIVar47,1);
          if (((pIVar45->Flags & 0x100) == 0) && (GImGui->SettingsDirtyTimer <= 0.0)) {
            GImGui->SettingsDirtyTimer = (GImGui->IO).IniSavingRate;
          }
          pIVar27->NavDisableMouseHover = true;
        }
      }
      if (pIVar37 != (ImGuiWindow *)0x0) {
        pIVar45 = pIVar27->NavWindow;
        if (pIVar45 == (ImGuiWindow *)0x0) {
          pIVar49 = (ImGuiViewportP *)0x0;
LAB_00129b9b:
          SetActiveID(0,(ImGuiWindow *)0x0);
          pIVar27->NavDisableHighlight = false;
          pIVar27->NavDisableMouseHover = true;
          pIVar37 = NavRestoreLastChildNavWindow(pIVar37);
          pIVar47 = (ImGuiContext *)0x0;
          ClosePopupsOverWindow(pIVar37,false);
          FocusWindow(pIVar37);
          if (pIVar37->NavLastIds[0] == 0) {
            pIVar47 = (ImGuiContext *)0x0;
            NavInitWindow(pIVar37,false);
          }
          if ((pIVar37->DC).NavLayersActiveMaskNext == 2) {
            pIVar27->NavLayer = ImGuiNavLayer_Menu;
          }
          if ((pIVar37->Viewport != pIVar49) &&
             (p_Var20 = (pIVar27->PlatformIO).Platform_SetWindowFocus,
             p_Var20 != (_func_void_ImGuiViewport_ptr *)0x0)) {
            (*p_Var20)(&pIVar37->Viewport->super_ImGuiViewport);
          }
        }
        else if (pIVar37 != pIVar45->RootWindow) {
          pIVar49 = pIVar45->Viewport;
          goto LAB_00129b9b;
        }
        pIVar27->NavWindowingTarget = (ImGuiWindow *)0x0;
      }
      if ((bVar29) && (pIVar27->NavWindow != (ImGuiWindow *)0x0)) {
        pIVar47 = (ImGuiContext *)0x0;
        SetActiveID(0,(ImGuiWindow *)0x0);
        pIVar37 = pIVar27->NavWindow;
        pIVar45 = pIVar37;
        do {
          window_00 = pIVar45;
          if ((window_00->ParentWindow == (ImGuiWindow *)0x0) ||
             (((window_00->DC).NavLayersActiveMask & 2) != 0)) break;
          pIVar45 = window_00->ParentWindow;
        } while ((window_00->Flags & 0x15000000U) == 0x1000000);
        if (window_00 != pIVar37) {
          FocusWindow(window_00);
          window_00->NavLastChildNavWindow = pIVar37;
          pIVar37 = pIVar27->NavWindow;
        }
        IVar9 = pIVar27->NavLayer;
        if (((pIVar37->DC).NavLayersActiveMask & 2) == 0) {
          layer = ImGuiNavLayer_Main;
          if (IVar9 == ImGuiNavLayer_Main) goto LAB_00129cf7;
        }
        else if (IVar9 == ImGuiNavLayer_Main) {
          layer = ImGuiNavLayer_Menu;
          if (window_00->DockNodeAsHost == (ImGuiDockNode *)0x0) {
            pIVar37->NavLastIds[1] = 0;
          }
        }
        else {
          layer = IVar9 ^ ImGuiNavLayer_Menu;
        }
        NavRestoreLayer(layer);
      }
LAB_00129cf7:
      if (((uVar32 & 1) == 0 && !bVar28) || (pIVar54->NavWindow == (ImGuiWindow *)0x0)) {
        (pIVar54->IO).NavActive = false;
LAB_00129d43:
        bVar29 = pIVar54->NavWindowingTarget != (ImGuiWindow *)0x0;
      }
      else {
        bVar29 = (pIVar54->NavWindow->Flags & 0x40000U) == 0;
        (pIVar54->IO).NavActive = bVar29;
        if (((!bVar29) || (pIVar54->NavId == 0)) ||
           (bVar29 = true, pIVar54->NavDisableHighlight != false)) goto LAB_00129d43;
      }
      (pIVar54->IO).NavVisible = bVar29;
      pIVar27 = GImGui;
      fVar61 = (GImGui->IO).NavInputsDownDuration[1];
      if ((fVar61 == 0.0) && (!NAN(fVar61))) {
        if (GImGui->ActiveId == 0) {
          if (GImGui->NavLayer == ImGuiNavLayer_Main) {
            pIVar37 = GImGui->NavWindow;
            if (pIVar37 == (ImGuiWindow *)0x0) {
              uVar60 = (GImGui->OpenPopupStack).Size;
              if ((int)uVar60 < 1) goto LAB_0012a28a;
LAB_0012a17e:
              if ((((GImGui->OpenPopupStack).Data[(ulong)uVar60 - 1].Window)->Flags & 0x8000000) ==
                  0) {
                pIVar47 = (ImGuiContext *)0x1;
                ClosePopupToLevel(uVar60 - 1,true);
              }
            }
            else if (((pIVar37 == pIVar37->RootWindow) || ((pIVar37->Flags & 0x4000000) != 0)) ||
                    (pIVar45 = pIVar37->ParentWindow, pIVar45 == (ImGuiWindow *)0x0)) {
              uVar60 = (GImGui->OpenPopupStack).Size;
              if (0 < (int)uVar60) goto LAB_0012a17e;
              if ((pIVar37->Flags & 0x5000000U) != 0x1000000) {
                pIVar37->NavLastIds[0] = 0;
              }
LAB_0012a28a:
              pIVar27->NavId = 0;
              pIVar27->NavFocusScopeId = 0;
            }
            else {
              if (pIVar37->ChildId == 0) {
                __assert_fail("child_window->ChildId != 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                              ,0x285a,"void ImGui::NavUpdateCancelRequest()");
              }
              IVar62 = pIVar37->Size;
              fVar83 = (pIVar37->Pos).x;
              fVar77 = (pIVar37->Pos).y;
              FocusWindow(pIVar45);
              fVar61 = (pIVar45->Pos).x;
              local_58._0_4_ = fVar83 - fVar61;
              fVar76 = (pIVar45->Pos).y;
              local_58._4_4_ = fVar77 - fVar76;
              local_58._8_4_ = (IVar62.x + fVar83) - fVar61;
              local_58._12_4_ = (IVar62.y + fVar77) - fVar76;
              pIVar47 = (ImGuiContext *)0x0;
              SetNavID(pIVar37->ChildId,ImGuiNavLayer_Main,0,(ImRect *)local_58);
            }
          }
          else {
            NavRestoreLayer(ImGuiNavLayer_Main);
          }
        }
        else if ((GImGui->ActiveIdUsingNavInputMask & 2) == 0) {
          pIVar47 = (ImGuiContext *)0x0;
          SetActiveID(0,(ImGuiWindow *)0x0);
        }
      }
      pIVar54->NavActivateId = 0;
      pIVar54->NavActivateDownId = 0;
      pIVar54->NavActivatePressedId = 0;
      pIVar54->NavActivateInputId = 0;
      pIVar54->NavActivateFlags = 0;
      uVar60 = pIVar54->NavId;
      uVar57 = 0;
      if (((uVar60 == 0) || (pIVar54->NavDisableHighlight != false)) ||
         (pIVar54->NavWindowingTarget != (ImGuiWindow *)0x0)) {
        pIVar47 = (ImGuiContext *)0x0;
        uVar57 = 0;
LAB_00129de3:
        if ((pIVar54->NavWindow != (ImGuiWindow *)0x0) &&
           ((pIVar54->NavWindow->Flags & 0x40000) != 0)) {
          pIVar54->NavDisableHighlight = true;
        }
        if (uVar57 != (uint)pIVar47 && (uint)pIVar47 != 0) {
          __assert_fail("g.NavActivateDownId == g.NavActivateId",
                        "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                        ,0x2733,"void ImGui::NavUpdate()");
        }
      }
      else if (pIVar54->NavWindow != (ImGuiWindow *)0x0) {
        pIVar47 = (ImGuiContext *)0x0;
        if ((pIVar54->NavWindow->Flags & 0x40000) != 0) goto LAB_00129de3;
        fVar61 = (GImGui->IO).NavInputs[0];
        if (0.0 < fVar61) {
          bVar29 = (GImGui->IO).NavInputsDownDuration[0] == 0.0;
        }
        else {
          bVar29 = false;
        }
        if ((GImGui->IO).NavInputs[2] <= 0.0) {
          bVar30 = false;
        }
        else {
          bVar30 = (GImGui->IO).NavInputsDownDuration[2] == 0.0;
        }
        uVar10 = pIVar54->ActiveId;
        if (bVar29 && uVar10 == 0) {
          pIVar54->NavActivateId = uVar60;
          pIVar54->NavActivateFlags = 2;
          pIVar47 = (ImGuiContext *)(ulong)uVar60;
LAB_0012ba54:
          if (bVar30) {
            pIVar54->NavActivateInputId = uVar60;
            pIVar54->NavActivateFlags = 1;
          }
          uVar57 = 0;
          if (0.0 < fVar61) {
            pIVar54->NavActivateDownId = uVar60;
            uVar57 = uVar60;
          }
        }
        else {
          if (uVar10 == 0) {
            pIVar47 = (ImGuiContext *)0x0;
            goto LAB_0012ba54;
          }
          if ((bool)(bVar30 & uVar10 == uVar60)) {
            pIVar54->NavActivateInputId = uVar60;
            pIVar54->NavActivateFlags = 1;
          }
          pIVar47 = (ImGuiContext *)0x0;
          uVar57 = 0;
          if (uVar10 == uVar60 && 0.0 < fVar61) {
            pIVar54->NavActivateDownId = uVar60;
            uVar57 = uVar60;
          }
          bVar29 = (bool)(bVar29 & uVar10 == uVar60);
        }
        if (bVar29) {
          pIVar54->NavActivatePressedId = uVar60;
        }
        goto LAB_00129de3;
      }
      IVar40 = pIVar54->NavNextActivateId;
      if (IVar40 != 0) {
        if ((pIVar54->NavNextActivateFlags & 1U) == 0) {
          pIVar54->NavActivatePressedId = IVar40;
          pIVar54->NavActivateDownId = IVar40;
          pIVar54->NavActivateId = IVar40;
        }
        else {
          pIVar54->NavActivateInputId = IVar40;
        }
        pIVar54->NavActivateFlags = pIVar54->NavNextActivateFlags;
      }
      pIVar54->NavNextActivateId = 0;
      pIVar27 = GImGui;
      pIVar37 = GImGui->NavWindow;
      if ((pIVar37 != (ImGuiWindow *)0x0 & GImGui->NavMoveForwardToNextFrame) == 1) {
        if ((GImGui->NavMoveDir == -1) || (GImGui->NavMoveClipDir == -1)) {
          __assert_fail("g.NavMoveDir != ImGuiDir_None && g.NavMoveClipDir != ImGuiDir_None",
                        "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                        ,0x278d,"void ImGui::NavUpdateCreateMoveRequest()");
        }
        if ((GImGui->NavMoveFlags & 0x80) == 0) {
          __assert_fail("g.NavMoveFlags & ImGuiNavMoveFlags_Forwarded",
                        "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                        ,0x278e,"void ImGui::NavUpdateCreateMoveRequest()");
        }
LAB_0012a3a5:
        iVar58 = pIVar27->NavMoveDir;
        pIVar27->NavMoveForwardToNextFrame = false;
        if (iVar58 != -1) {
          move_flags = pIVar27->NavMoveFlags;
          local_88 = 0.0;
          goto LAB_0012a3c7;
        }
        local_88 = 0.0;
      }
      else {
        GImGui->NavMoveDir = -1;
        pIVar27->NavMoveFlags = 0;
        pIVar27->NavMoveScrollFlags = 0;
        if (pIVar37 == (ImGuiWindow *)0x0) {
          pIVar27->NavMoveClipDir = -1;
          goto LAB_0012a3a5;
        }
        pIVar45 = pIVar27->NavWindowingTarget;
        iVar58 = -1;
        iVar56 = -1;
        if ((pIVar45 != (ImGuiWindow *)0x0) || ((pIVar37->Flags & 0x40000) != 0)) {
LAB_0012a1b4:
          pIVar27->NavMoveClipDir = iVar56;
          if ((((iVar56 == -1) && (((pIVar27->IO).ConfigFlags & 1U) != 0)) &&
              (pIVar45 == (ImGuiWindow *)0x0)) &&
             (((pIVar37->Flags & 0x40000U) == 0 && (pIVar27->NavLayer == ImGuiNavLayer_Main)))) {
            uVar60 = (pIVar27->IO).KeyMap[5];
            uVar50 = 0;
            uVar57 = 0;
            if (-1 < (long)(int)uVar60) {
              if (0x1ff < uVar60) goto LAB_0012bd52;
              if ((pIVar27->IO).KeysDown[(int)uVar60] == true) {
                uVar57 = (uint)((pIVar27->ActiveIdUsingKeyInputMask & 0x20) == 0);
              }
            }
            uVar60 = (pIVar27->IO).KeyMap[6];
            if (-1 < (long)(int)uVar60) {
              if (0x1ff < uVar60) {
LAB_0012bd52:
                __assert_fail("user_key_index >= 0 && user_key_index < ((int)(sizeof(g.IO.KeysDown) / sizeof(*(g.IO.KeysDown))))"
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                              ,0x135b,"bool ImGui::IsKeyDown(int)");
              }
              if ((pIVar27->IO).KeysDown[(int)uVar60] == true) {
                uVar50 = (ulong)((pIVar27->ActiveIdUsingKeyInputMask & 0x40) == 0);
              }
            }
            uVar60 = (uint)uVar50;
            bVar29 = IsKeyPressed((pIVar27->IO).KeyMap[7],true);
            if (bVar29) {
              bVar29 = (GImGui->ActiveIdUsingKeyInputMask & 0x80) == 0;
            }
            else {
              bVar29 = false;
            }
            pIVar47 = (ImGuiContext *)0x1;
            bVar30 = IsKeyPressed((pIVar27->IO).KeyMap[8],true);
            if (bVar30) {
              uVar41 = (undefined4)
                       CONCAT71((int7)(uVar50 >> 8),(GImGui->ActiveIdUsingKeyInputMask & 0x100) == 0
                               );
            }
            else {
              uVar41 = 0;
            }
            if ((uVar57 != uVar60) || (bVar29 != SUB41(uVar41,0))) {
              if (((pIVar37->DC).NavLayersActiveMask != 0) || ((pIVar37->DC).NavHasScroll != true))
              {
                IVar9 = pIVar27->NavLayer;
                pIVar46 = pIVar37->NavRectRel + IVar9;
                fVar61 = GImGui->FontBaseSize * pIVar37->FontWindowScale * pIVar37->FontDpiScale;
                if (pIVar37->ParentWindow != (ImGuiWindow *)0x0) {
                  fVar61 = fVar61 * pIVar37->ParentWindow->FontWindowScale;
                }
                local_88 = (pIVar37->NavRectRel[IVar9].Max.y - pIVar37->NavRectRel[IVar9].Min.y) +
                           (((pIVar37->InnerRect).Max.y - (pIVar37->InnerRect).Min.y) - fVar61);
                local_88 = (float)(~-(uint)(local_88 <= 0.0) & (uint)local_88);
                local_34 = uVar41;
                bVar30 = IsKeyPressed((pIVar27->IO).KeyMap[5],true);
                if (bVar30) {
                  local_88 = -local_88;
                  pIVar27->NavMoveDir = 3;
                  pIVar27->NavMoveClipDir = 2;
                  pIVar27->NavMoveFlags = 0x30;
                  iVar58 = 3;
                  move_flags = 0x30;
                }
                else {
                  pIVar47 = (ImGuiContext *)0x1;
                  bVar30 = IsKeyPressed((pIVar27->IO).KeyMap[6],true);
                  if (bVar30) {
                    pIVar27->NavMoveDir = 2;
                    pIVar27->NavMoveClipDir = 3;
                    pIVar27->NavMoveFlags = 0x30;
                    iVar58 = 2;
                    move_flags = 0x30;
                  }
                  else {
                    if (bVar29 == false) {
                      if ((char)local_34 == '\0') goto LAB_0012a3a5;
                      fVar61 = ((pIVar37->ScrollMax).y + (pIVar37->SizeFull).y) -
                               (pIVar37->Scroll).y;
                      pIVar37->NavRectRel[IVar9].Max.y = fVar61;
                      pIVar37->NavRectRel[IVar9].Min.y = fVar61;
                      fVar61 = (pIVar46->Min).x;
                      pIVar1 = &pIVar37->NavRectRel[IVar9].Max;
                      if (pIVar1->x <= fVar61 && fVar61 != pIVar1->x) {
                        pIVar37->NavRectRel[IVar9].Max.x = 0.0;
                        (pIVar46->Min).x = 0.0;
                      }
                      pIVar27->NavMoveDir = 2;
                      pIVar27->NavMoveFlags = 0x50;
                      iVar58 = 2;
                    }
                    else {
                      fVar61 = -(pIVar37->Scroll).y;
                      pIVar37->NavRectRel[IVar9].Max.y = fVar61;
                      pIVar37->NavRectRel[IVar9].Min.y = fVar61;
                      fVar61 = (pIVar46->Min).x;
                      pIVar1 = &pIVar37->NavRectRel[IVar9].Max;
                      if (pIVar1->x <= fVar61 && fVar61 != pIVar1->x) {
                        pIVar37->NavRectRel[IVar9].Max.x = 0.0;
                        (pIVar46->Min).x = 0.0;
                      }
                      pIVar27->NavMoveDir = 3;
                      pIVar27->NavMoveFlags = 0x50;
                      iVar58 = 3;
                    }
                    local_88 = 0.0;
                    move_flags = 0x50;
                  }
                }
                goto LAB_0012bb92;
              }
              pIVar47 = (ImGuiContext *)0x1;
              bVar30 = IsKeyPressed((pIVar27->IO).KeyMap[5],true);
              if (bVar30) {
                fVar61 = (pIVar37->Scroll).y -
                         ((pIVar37->InnerRect).Max.y - (pIVar37->InnerRect).Min.y);
LAB_0012bbd0:
                (pIVar37->ScrollTarget).y = fVar61;
              }
              else {
                pIVar47 = (ImGuiContext *)0x1;
                bVar30 = IsKeyPressed((pIVar27->IO).KeyMap[6],true);
                if (bVar30) {
                  fVar61 = ((pIVar37->InnerRect).Max.y - (pIVar37->InnerRect).Min.y) +
                           (pIVar37->Scroll).y;
                  goto LAB_0012bbd0;
                }
                if (bVar29 == false) {
                  if (SUB41(uVar41,0) == false) goto LAB_0012a3a5;
                  fVar61 = (pIVar37->ScrollMax).y;
                  goto LAB_0012bbd0;
                }
                (pIVar37->ScrollTarget).y = 0.0;
              }
              (pIVar37->ScrollTargetCenterRatio).y = 0.0;
              (pIVar37->ScrollTargetEdgeSnapDist).y = 0.0;
            }
          }
          goto LAB_0012a3a5;
        }
        uVar60 = pIVar27->ActiveIdUsingNavDirMask;
        if ((uVar60 & 1) == 0) {
          pIVar47 = (ImGuiContext *)0x3;
          fVar61 = GetNavInputAmount(4,ImGuiInputReadMode_Repeat);
          if (fVar61 <= 0.0) {
            pIVar47 = (ImGuiContext *)0x3;
            fVar61 = GetNavInputAmount(0x10,ImGuiInputReadMode_Repeat);
            iVar58 = -1;
            if (fVar61 <= 0.0) goto LAB_00129f61;
          }
          pIVar27->NavMoveDir = 0;
          iVar58 = 0;
        }
LAB_00129f61:
        if ((uVar60 & 2) == 0) {
          pIVar47 = (ImGuiContext *)0x3;
          fVar61 = GetNavInputAmount(5,ImGuiInputReadMode_Repeat);
          if (fVar61 <= 0.0) {
            pIVar47 = (ImGuiContext *)0x3;
            fVar61 = GetNavInputAmount(0x11,ImGuiInputReadMode_Repeat);
            if (fVar61 <= 0.0) goto LAB_00129fac;
          }
          pIVar27->NavMoveDir = 1;
          iVar58 = 1;
        }
LAB_00129fac:
        iVar56 = iVar58;
        if ((uVar60 & 4) == 0) {
          pIVar47 = (ImGuiContext *)0x3;
          fVar61 = GetNavInputAmount(6,ImGuiInputReadMode_Repeat);
          if (fVar61 <= 0.0) {
            pIVar47 = (ImGuiContext *)0x3;
            fVar61 = GetNavInputAmount(0x12,ImGuiInputReadMode_Repeat);
            if (fVar61 <= 0.0) goto LAB_00129ff7;
          }
          pIVar27->NavMoveDir = 2;
          iVar56 = 2;
        }
LAB_00129ff7:
        if ((uVar60 & 8) != 0) goto LAB_0012a1b4;
        iVar58 = 3;
        fVar61 = GetNavInputAmount(7,ImGuiInputReadMode_Repeat);
        if (fVar61 <= 0.0) {
          pIVar47 = (ImGuiContext *)0x3;
          fVar61 = GetNavInputAmount(0x13,ImGuiInputReadMode_Repeat);
          if (fVar61 <= 0.0) goto LAB_0012a1b4;
        }
        local_88 = 0.0;
        pIVar27->NavMoveDir = 3;
        pIVar27->NavMoveClipDir = 3;
        move_flags = 0;
LAB_0012bb92:
        pIVar27->NavMoveForwardToNextFrame = false;
LAB_0012a3c7:
        pIVar47 = (ImGuiContext *)(ulong)(uint)pIVar27->NavMoveClipDir;
        NavMoveRequestSubmit(iVar58,pIVar27->NavMoveClipDir,move_flags,pIVar27->NavMoveScrollFlags);
      }
      if (pIVar27->NavMoveSubmitted == true) {
        if (pIVar27->NavId == 0) {
          pIVar27->NavInitRequest = true;
          pIVar27->NavInitRequestFromMove = true;
          pIVar27->NavInitResultId = 0;
          pIVar27->NavDisableHighlight = false;
        }
        if ((pIVar27->NavInputSource != ImGuiInputSource_Gamepad) ||
           (pIVar27->NavLayer != ImGuiNavLayer_Main || pIVar37 == (ImGuiWindow *)0x0))
        goto LAB_0012a52d;
        fVar61 = (pIVar37->Pos).x;
        fVar76 = (pIVar37->Pos).y;
        auVar69._0_4_ = ((pIVar37->InnerRect).Min.x - fVar61) + -1.0;
        auVar69._4_4_ = ((pIVar37->InnerRect).Min.y - fVar76) + -1.0;
        auVar69._8_4_ = ((pIVar37->InnerRect).Max.x - fVar61) + 1.0;
        auVar69._12_4_ = ((pIVar37->InnerRect).Max.y - fVar76) + 1.0;
        if ((((pIVar37->NavRectRel[0].Min.x < auVar69._0_4_) ||
             (pIVar37->NavRectRel[0].Min.y < auVar69._4_4_)) ||
            (auVar69._8_4_ < pIVar37->NavRectRel[0].Max.x)) ||
           (auVar69._12_4_ < pIVar37->NavRectRel[0].Max.y)) {
          fVar61 = GImGui->FontBaseSize * pIVar37->FontWindowScale * pIVar37->FontDpiScale;
          if (pIVar37->ParentWindow != (ImGuiWindow *)0x0) {
            fVar61 = fVar61 * pIVar37->ParentWindow->FontWindowScale;
          }
          auVar79._0_4_ = fVar61 * 0.5;
          auVar73._0_4_ = auVar69._8_4_ - auVar69._0_4_;
          auVar73._4_4_ = auVar69._12_4_ - auVar69._4_4_;
          auVar73._8_4_ = auVar69._8_4_ - auVar69._8_4_;
          auVar73._12_4_ = auVar69._12_4_ - auVar69._12_4_;
          auVar79._4_4_ = auVar79._0_4_;
          auVar79._8_4_ = auVar79._0_4_;
          auVar79._12_4_ = auVar79._0_4_;
          auVar74 = minps(auVar73,auVar79);
          local_58._0_4_ = auVar74._0_4_ + auVar69._0_4_;
          local_58._4_4_ = auVar74._4_4_ + auVar69._4_4_;
          auVar26._4_8_ = auVar69._8_8_;
          auVar26._0_4_ = auVar69._4_4_ - auVar79._0_4_;
          auVar70._0_8_ = auVar26._0_8_ << 0x20;
          auVar70._8_4_ = auVar69._8_4_ - auVar74._0_4_;
          auVar70._12_4_ = auVar69._12_4_ - auVar74._4_4_;
          local_58._8_8_ = auVar70._8_8_;
          pIVar47 = (ImGuiContext *)local_58;
          ImRect::ClipWithFull(pIVar37->NavRectRel,(ImRect *)pIVar47);
          pIVar27->NavId = 0;
          pIVar27->NavFocusScopeId = 0;
        }
LAB_0012a536:
        IVar9 = pIVar27->NavLayer;
        fVar61 = pIVar37->NavRectRel[IVar9].Min.x;
        fVar83 = pIVar37->NavRectRel[IVar9].Max.x;
        if (fVar83 < fVar61) {
LAB_0012a573:
          fVar77 = 0.0;
          fVar83 = 0.0;
          fVar76 = 0.0;
          fVar61 = 0.0;
        }
        else {
          fVar76 = pIVar37->NavRectRel[IVar9].Min.y;
          fVar77 = pIVar37->NavRectRel[IVar9].Max.y;
          if (fVar77 < fVar76) goto LAB_0012a573;
        }
        fVar75 = (pIVar37->Pos).y;
        fVar76 = fVar76 + fVar75 + local_88;
        local_88 = fVar77 + fVar75 + local_88;
        if (local_88 < fVar76) {
          __assert_fail("!scoring_rect.IsInverted()",
                        "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                        ,0x27db,"void ImGui::NavUpdateCreateMoveRequest()");
        }
        fVar77 = (pIVar37->Pos).x;
        fVar83 = fVar83 + fVar77;
        fVar61 = fVar61 + fVar77 + 1.0;
        if (fVar83 <= fVar61) {
          fVar61 = fVar83;
        }
      }
      else {
LAB_0012a52d:
        if (pIVar37 != (ImGuiWindow *)0x0) goto LAB_0012a536;
        local_88 = 0.0;
        fVar76 = 0.0;
        fVar61 = 0.0;
      }
      (pIVar27->NavScoringRect).Min.x = fVar61;
      (pIVar27->NavScoringRect).Min.y = fVar76;
      (pIVar27->NavScoringRect).Max.x = fVar61;
      (pIVar27->NavScoringRect).Max.y = local_88;
      pIVar27 = GImGui;
      if (GImGui->NavMoveScoringItems == false) {
        pbVar52 = &GImGui->NavInitRequest;
        GImGui->NavAnyRequest = *pbVar52;
        if (*pbVar52 != false) goto LAB_0012a614;
      }
      else {
        GImGui->NavAnyRequest = true;
LAB_0012a614:
        if (pIVar27->NavWindow == (ImGuiWindow *)0x0) {
          __assert_fail("g.NavWindow != __null",
                        "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                        ,0x2663,"void ImGui::NavUpdateAnyRequestFlag()");
        }
      }
      pIVar37 = pIVar54->NavWindow;
      if (((pIVar37 != (ImGuiWindow *)0x0) && ((pIVar37->Flags & 0x40000) == 0)) &&
         (pIVar54->NavWindowingTarget == (ImGuiWindow *)0x0)) {
        fVar61 = pIVar27->FontBaseSize * pIVar37->FontWindowScale * pIVar37->FontDpiScale;
        if (pIVar37->ParentWindow != (ImGuiWindow *)0x0) {
          fVar61 = fVar61 * pIVar37->ParentWindow->FontWindowScale;
        }
        fVar61 = (float)(int)(fVar61 * 100.0 * (pIVar54->IO).DeltaTime + 0.5);
        if (((pIVar37->DC).NavLayersActiveMask == 0) &&
           (uVar60 = pIVar54->NavMoveDir, (uVar60 != 0xffffffff & (pIVar37->DC).NavHasScroll) == 1))
        {
          if (uVar60 < 2) {
            (pIVar37->ScrollTarget).x =
                 (float)(int)(*(float *)(&DAT_001a7d78 + (ulong)(uVar60 == 0) * 4) * fVar61 +
                             (pIVar37->Scroll).x);
            (pIVar37->ScrollTargetCenterRatio).x = 0.0;
            (pIVar37->ScrollTargetEdgeSnapDist).x = 0.0;
          }
          if ((uVar60 & 0xfffffffe) == 2) {
            (pIVar37->ScrollTarget).y =
                 (float)(int)(*(float *)(&DAT_001a7d78 + (ulong)(uVar60 == 2) * 4) * fVar61 +
                             (pIVar37->Scroll).y);
            (pIVar37->ScrollTargetCenterRatio).y = 0.0;
            (pIVar37->ScrollTargetEdgeSnapDist).y = 0.0;
          }
        }
        pIVar47 = (ImGuiContext *)0x0;
        IVar62 = GetNavInputAmount2d(4,ImGuiInputReadMode_Down,0.1,10.0);
        fVar76 = IVar62.x;
        fVar83 = IVar62.y;
        if (((fVar76 != 0.0) || (NAN(fVar76))) && (pIVar37->ScrollbarX == true)) {
          (pIVar37->ScrollTarget).x = (float)(int)(fVar76 * fVar61 + (pIVar37->Scroll).x);
          (pIVar37->ScrollTargetCenterRatio).x = 0.0;
          (pIVar37->ScrollTargetEdgeSnapDist).x = 0.0;
        }
        if ((fVar83 != 0.0) || (NAN(fVar83))) {
          (pIVar37->ScrollTarget).y = (float)(int)(fVar83 * fVar61 + (pIVar37->Scroll).y);
          (pIVar37->ScrollTargetCenterRatio).y = 0.0;
          (pIVar37->ScrollTargetEdgeSnapDist).y = 0.0;
        }
      }
      if ((uVar32 & 1) == 0 && !bVar28) {
        pIVar54->NavMousePosDirty = false;
        pIVar54->NavDisableHighlight = true;
        pIVar54->NavDisableMouseHover = false;
      }
      pIVar54->NavScoringDebugCount = 0;
      pIVar1 = &(pIVar27->IO).MousePos;
      bVar28 = IsMousePosValid(pIVar1);
      if (bVar28) {
        IVar62 = (pIVar27->IO).MousePos;
        IVar63.x = (float)(int)IVar62.x;
        IVar63.y = (float)(int)IVar62.y;
        pIVar27->MouseLastValidPos = IVar63;
        (pIVar27->IO).MousePos = IVar63;
      }
      bVar28 = IsMousePosValid(pIVar1);
      if ((bVar28) && (bVar28 = IsMousePosValid(&(pIVar27->IO).MousePosPrev), bVar28)) {
        IVar62 = (pIVar27->IO).MousePos;
        IVar63 = (pIVar27->IO).MousePosPrev;
        IVar64.x = IVar62.x - IVar63.x;
        IVar64.y = IVar62.y - IVar63.y;
        (pIVar27->IO).MouseDelta = IVar64;
        if ((((IVar64.x != 0.0) || (NAN(IVar64.x))) || (IVar64.y != 0.0)) || (NAN(IVar64.y))) {
          pIVar27->NavDisableMouseHover = false;
        }
      }
      else {
        (pIVar27->IO).MouseDelta.x = 0.0;
        (pIVar27->IO).MouseDelta.y = 0.0;
      }
      (pIVar27->IO).MousePosPrev = (pIVar27->IO).MousePos;
      lVar51 = 0;
      do {
        if ((pIVar27->IO).MouseDown[lVar51] == true) {
          fVar61 = (pIVar27->IO).MouseDownDuration[lVar51];
          pbVar52 = (pIVar27->IO).MouseClicked + lVar51;
          *pbVar52 = fVar61 < 0.0;
          pbVar52[10] = false;
          (pIVar27->IO).MouseDownDurationPrev[lVar51] = fVar61;
          if (0.0 <= fVar61) {
            (pIVar27->IO).MouseDownDuration[lVar51] = fVar61 + (pIVar27->IO).DeltaTime;
            (pIVar27->IO).MouseDoubleClicked[lVar51] = false;
            bVar28 = IsMousePosValid(pIVar1);
            auVar71 = ZEXT816(0);
            if (bVar28) {
              IVar62 = (pIVar27->IO).MousePos;
              IVar63 = (pIVar27->IO).MouseClickedPos[lVar51];
              auVar71._0_4_ = IVar62.x - IVar63.x;
              auVar71._4_4_ = IVar62.y - IVar63.y;
              auVar71._8_8_ = 0;
            }
            fVar61 = (pIVar27->IO).MouseDragMaxDistanceSqr[lVar51];
            fVar76 = auVar71._0_4_ * auVar71._0_4_ + auVar71._4_4_ * auVar71._4_4_;
            uVar32 = -(uint)(fVar76 <= fVar61);
            (pIVar27->IO).MouseDragMaxDistanceSqr[lVar51] =
                 (float)(~uVar32 & (uint)fVar76 | (uint)fVar61 & uVar32);
            IVar62 = (pIVar27->IO).MouseDragMaxDistanceAbs[lVar51];
            auVar80._0_8_ = auVar71._0_8_ ^ 0x8000000080000000;
            auVar80._8_4_ = auVar71._8_4_ ^ 0x80000000;
            auVar80._12_4_ = auVar71._12_4_ ^ 0x80000000;
            auVar74 = maxps(auVar80,auVar71);
            fVar61 = IVar62.x;
            fVar76 = IVar62.y;
            uVar32 = -(uint)(auVar74._0_4_ <= fVar61);
            uVar60 = -(uint)(auVar74._4_4_ <= fVar76);
            pIVar6 = (pIVar27->IO).MouseDragMaxDistanceAbs + lVar51;
            pIVar6->x = (float)(~uVar32 & (uint)auVar74._0_4_ | (uint)fVar61 & uVar32);
            pIVar6->y = (float)(~uVar60 & (uint)auVar74._4_4_ | (uint)fVar76 & uVar60);
          }
          else {
            (pIVar27->IO).MouseDownDuration[lVar51] = 0.0;
            (pIVar27->IO).MouseDoubleClicked[lVar51] = false;
            dVar65 = pIVar27->Time;
            if ((float)(dVar65 - (pIVar27->IO).MouseClickedTime[lVar51]) <
                (pIVar27->IO).MouseDoubleClickTime) {
              bVar28 = IsMousePosValid(pIVar1);
              fVar61 = 0.0;
              fVar76 = 0.0;
              if (bVar28) {
                IVar62 = (pIVar27->IO).MousePos;
                IVar63 = (pIVar27->IO).MouseClickedPos[lVar51];
                fVar61 = IVar62.x - IVar63.x;
                fVar76 = IVar62.y - IVar63.y;
              }
              fVar83 = (pIVar27->IO).MouseDoubleClickMaxDist;
              if (fVar61 * fVar61 + fVar76 * fVar76 < fVar83 * fVar83) {
                (pIVar27->IO).MouseDoubleClicked[lVar51] = true;
              }
              dVar65 = (double)((pIVar27->IO).MouseDoubleClickTime * -2.0);
            }
            (pIVar27->IO).MouseClickedTime[lVar51] = dVar65;
            (pIVar27->IO).MouseClickedPos[lVar51] = (pIVar27->IO).MousePos;
            (pIVar27->IO).MouseDownWasDoubleClick[lVar51] = (pIVar27->IO).MouseDoubleClicked[lVar51]
            ;
            pIVar6 = (pIVar27->IO).MouseDragMaxDistanceAbs + lVar51;
            pIVar6->x = 0.0;
            pIVar6->y = 0.0;
            (pIVar27->IO).MouseDragMaxDistanceSqr[lVar51] = 0.0;
          }
        }
        else {
          (pIVar27->IO).MouseClicked[lVar51] = false;
          fVar61 = (pIVar27->IO).MouseDownDuration[lVar51];
          (pIVar27->IO).MouseReleased[lVar51] = 0.0 <= fVar61;
          pbVar52 = (pIVar27->IO).MouseClicked + lVar51;
          (pIVar27->IO).MouseDownDurationPrev[lVar51] = fVar61;
          (pIVar27->IO).MouseDownDuration[lVar51] = -1.0;
          (pIVar27->IO).MouseDoubleClicked[lVar51] = false;
        }
        if (((pIVar27->IO).MouseDown[lVar51] == false) &&
           ((pIVar27->IO).MouseReleased[lVar51] == false)) {
          (pIVar27->IO).MouseDownWasDoubleClick[lVar51] = false;
        }
        if (*pbVar52 == true) {
          pIVar27->NavDisableMouseHover = false;
        }
        lVar51 = lVar51 + 1;
      } while (lVar51 != 5);
      DockContextNewFrameUpdateUndocking(ctx_00);
      UpdateHoveredWindowAndCaptureFlags();
      UpdateMouseMovingWindowNewFrame();
      pIVar37 = GetTopMostPopupModal();
      if ((pIVar37 != (ImGuiWindow *)0x0) ||
         ((ctx_00->NavWindowingTarget != (ImGuiWindow *)0x0 &&
          (0.0 < ctx_00->NavWindowingHighlightAlpha)))) {
        fVar61 = (ctx_00->IO).DeltaTime * 6.0 + ctx_00->DimBgRatio;
        if (1.0 <= fVar61) {
          fVar61 = 1.0;
        }
        ctx_00->DimBgRatio = fVar61;
      }
      else {
        fVar61 = (ctx_00->IO).DeltaTime * -10.0 + ctx_00->DimBgRatio;
        ctx_00->DimBgRatio = (float)(-(uint)(0.0 <= fVar61) & (uint)fVar61);
      }
      ctx_00->MouseCursor = 0;
      ctx_00->WantTextInputNextFrame = -1;
      ctx_00->WantCaptureMouseNextFrame = -1;
      ctx_00->WantCaptureKeyboardNextFrame = -1;
      (ctx_00->PlatformImePos).x = 1.0;
      (ctx_00->PlatformImePos).y = 1.0;
      ctx_00->PlatformImePosViewport = (ImGuiViewportP *)0x0;
      pIVar54 = GImGui;
      if (GImGui->WheelingWindow != (ImGuiWindow *)0x0) {
        GImGui->WheelingWindowTimer = GImGui->WheelingWindowTimer - (GImGui->IO).DeltaTime;
        bVar28 = IsMousePosValid((ImVec2 *)0x0);
        if (((bVar28) &&
            (fVar61 = (pIVar54->IO).MouseDragThreshold,
            fVar76 = (pIVar54->IO).MousePos.x - (pIVar54->WheelingWindowRefMousePos).x,
            fVar83 = (pIVar54->IO).MousePos.y - (pIVar54->WheelingWindowRefMousePos).y,
            fVar61 * fVar61 < fVar76 * fVar76 + fVar83 * fVar83)) ||
           (pIVar54->WheelingWindowTimer <= 0.0)) {
          pIVar54->WheelingWindow = (ImGuiWindow *)0x0;
          pIVar54->WheelingWindowTimer = 0.0;
        }
      }
      pIVar27 = GImGui;
      fVar61 = (pIVar54->IO).MouseWheel;
      if (((((fVar61 != 0.0) || (fVar76 = (pIVar54->IO).MouseWheelH, fVar76 != 0.0)) ||
           (NAN(fVar76))) &&
          ((pIVar54->ActiveId == 0 || (pIVar54->ActiveIdUsingMouseWheel == false)))) &&
         (((pIVar54->HoveredIdPreviousFrame == 0 ||
           (pIVar54->HoveredIdPreviousFrameUsingMouseWheel == false)) &&
          (((pIVar37 = pIVar54->WheelingWindow, pIVar37 != (ImGuiWindow *)0x0 ||
            (pIVar37 = pIVar54->HoveredWindow, pIVar37 != (ImGuiWindow *)0x0)) &&
           (pIVar37->Collapsed == false)))))) {
        bVar28 = (pIVar54->IO).KeyCtrl;
        if ((fVar61 != 0.0) || (NAN(fVar61))) {
          if ((bVar28 & 1U) == 0) goto LAB_0012b704;
          if ((pIVar54->IO).FontAllowUserScaling == true) {
            if (GImGui->WheelingWindow != pIVar37) {
              GImGui->WheelingWindow = pIVar37;
              pIVar27->WheelingWindowRefMousePos = (pIVar27->IO).MousePos;
              pIVar27->WheelingWindowTimer = 2.0;
              fVar61 = (pIVar54->IO).MouseWheel;
            }
            fVar76 = pIVar37->FontWindowScale;
            fVar83 = fVar61 * 0.1 + fVar76;
            fVar61 = 2.5;
            if (fVar83 <= 2.5) {
              fVar61 = fVar83;
            }
            fVar61 = (float)(-(uint)(fVar83 < 0.5) & 0x3f000000 |
                            ~-(uint)(fVar83 < 0.5) & (uint)fVar61);
            pIVar37->FontWindowScale = fVar61;
            if (pIVar37 == pIVar37->RootWindow) {
              fVar61 = fVar61 / fVar76;
              IVar62 = pIVar37->Size;
              auVar81._8_8_ = 0;
              auVar81._0_4_ = IVar62.x;
              auVar81._4_4_ = IVar62.y;
              IVar63 = (pIVar54->IO).MousePos;
              fVar76 = (pIVar37->Pos).x;
              fVar83 = (pIVar37->Pos).y;
              auVar84._0_4_ = (IVar63.x - fVar76) * (1.0 - fVar61) * IVar62.x;
              auVar84._4_4_ = (IVar63.y - fVar83) * (1.0 - fVar61) * IVar62.y;
              auVar84._8_8_ = 0;
              auVar74 = divps(auVar84,auVar81);
              local_58._0_4_ = auVar74._0_4_ + fVar76;
              local_58._4_4_ = auVar74._4_4_ + fVar83;
              pIVar47 = (ImGuiContext *)local_58;
              SetWindowPos(pIVar37,(ImVec2 *)pIVar47,0);
              IVar62 = pIVar37->SizeFull;
              IVar66.x = (float)(int)((pIVar37->Size).x * fVar61);
              IVar66.y = (float)(int)((pIVar37->Size).y * fVar61);
              pIVar37->Size = IVar66;
              (pIVar37->SizeFull).x = (float)(int)(IVar62.x * fVar61);
              (pIVar37->SizeFull).y = (float)(int)(IVar62.y * fVar61);
            }
          }
        }
        else if ((bVar28 & 1U) == 0) {
LAB_0012b704:
          if (((pIVar54->IO).KeyShift != true) ||
             (fVar76 = fVar61, (pIVar54->IO).ConfigMacOSXBehaviors == true)) {
            fVar76 = (pIVar54->IO).MouseWheelH;
            if ((fVar61 != 0.0) || (NAN(fVar61))) {
              if (GImGui->WheelingWindow != pIVar37) {
                GImGui->WheelingWindow = pIVar37;
                pIVar27->WheelingWindowRefMousePos = (pIVar27->IO).MousePos;
                pIVar27->WheelingWindowTimer = 2.0;
              }
              uVar32 = pIVar37->Flags;
              while (((uVar32 >> 0x18 & 1) != 0 &&
                     (((uVar32 & 0x210) == 0x10 ||
                      ((fVar83 = (pIVar37->ScrollMax).y, fVar83 == 0.0 && (!NAN(fVar83)))))))) {
                pIVar37 = pIVar37->ParentWindow;
                uVar32 = pIVar37->Flags;
              }
              if ((uVar32 & 0x210) == 0) {
                fVar83 = ((pIVar37->InnerRect).Max.y - (pIVar37->InnerRect).Min.y) * 0.67;
                fVar77 = pIVar27->FontBaseSize * pIVar37->FontWindowScale * pIVar37->FontDpiScale;
                if (pIVar37->ParentWindow != (ImGuiWindow *)0x0) {
                  fVar77 = fVar77 * pIVar37->ParentWindow->FontWindowScale;
                }
                fVar75 = fVar77 * 5.0;
                if (fVar83 <= fVar77 * 5.0) {
                  fVar75 = fVar83;
                }
                (pIVar37->ScrollTarget).y = (pIVar37->Scroll).y - fVar61 * (float)(int)fVar75;
                (pIVar37->ScrollTargetCenterRatio).y = 0.0;
                (pIVar37->ScrollTargetEdgeSnapDist).y = 0.0;
              }
            }
          }
          pIVar54 = GImGui;
          if ((fVar76 != 0.0) || (NAN(fVar76))) {
            if (GImGui->WheelingWindow != pIVar37) {
              GImGui->WheelingWindow = pIVar37;
              pIVar54->WheelingWindowRefMousePos = (pIVar54->IO).MousePos;
              pIVar54->WheelingWindowTimer = 2.0;
            }
            while ((uVar32 = pIVar37->Flags, (uVar32 >> 0x18 & 1) != 0 &&
                   (((uVar32 & 0x210) == 0x10 ||
                    ((fVar61 = (pIVar37->ScrollMax).x, fVar61 == 0.0 && (!NAN(fVar61)))))))) {
              pIVar37 = pIVar37->ParentWindow;
            }
            if ((uVar32 & 0x210) == 0) {
              fVar61 = ((pIVar37->InnerRect).Max.x - (pIVar37->InnerRect).Min.x) * 0.67;
              fVar83 = pIVar54->FontBaseSize * pIVar37->FontWindowScale * pIVar37->FontDpiScale;
              if (pIVar37->ParentWindow != (ImGuiWindow *)0x0) {
                fVar83 = fVar83 * pIVar37->ParentWindow->FontWindowScale;
              }
              fVar77 = fVar83 + fVar83;
              if (fVar61 <= fVar83 + fVar83) {
                fVar77 = fVar61;
              }
              (pIVar37->ScrollTarget).x = (pIVar37->Scroll).x - fVar76 * (float)(int)fVar77;
              (pIVar37->ScrollTargetCenterRatio).x = 0.0;
              (pIVar37->ScrollTargetEdgeSnapDist).x = 0.0;
            }
          }
        }
      }
      pIVar54 = GImGui;
      GImGui->TabFocusPressed = false;
      pIVar37 = pIVar54->NavWindow;
      if (((((pIVar37 != (ImGuiWindow *)0x0) && (pIVar37->Active == true)) &&
           ((pIVar37->Flags & 0x40000) == 0)) &&
          (((pIVar54->IO).KeyCtrl == false && ((pIVar54->IO).KeyAlt == false)))) &&
         (iVar56 = (pIVar54->IO).KeyMap[0], -1 < iVar56)) {
        pIVar47 = (ImGuiContext *)0x1;
        bVar28 = IsKeyPressed(iVar56,true);
        if ((bVar28) && ((GImGui->ActiveIdUsingKeyInputMask & 1) == 0)) {
          pIVar54->TabFocusPressed = true;
        }
      }
      if ((pIVar54->ActiveId == 0) && (pIVar54->TabFocusPressed == true)) {
        pIVar54->TabFocusRequestNextWindow = pIVar54->NavWindow;
        if ((pIVar54->NavId == 0) || (iVar56 = pIVar54->NavIdTabCounter, iVar56 == 0x7fffffff)) {
          iVar56 = 0;
        }
        pIVar54->TabFocusRequestNextCounterTabStop = iVar56 - (uint)(pIVar54->IO).KeyShift;
      }
      pIVar54->TabFocusRequestCurrWindow = (ImGuiWindow *)0x0;
      pIVar54->TabFocusRequestCurrCounterTabStop = 0x7fffffff;
      pIVar37 = pIVar54->TabFocusRequestNextWindow;
      if (pIVar37 != (ImGuiWindow *)0x0) {
        pIVar54->TabFocusRequestCurrWindow = pIVar37;
        if ((pIVar54->TabFocusRequestNextCounterTabStop != 0x7fffffff) &&
           (iVar56 = (pIVar37->DC).FocusCounterTabStop, iVar56 != -1)) {
          pIVar47 = (ImGuiContext *)(ulong)(iVar56 + 1U);
          pIVar54->TabFocusRequestCurrCounterTabStop =
               (pIVar54->TabFocusRequestNextCounterTabStop + iVar56 + 1) % (int)(iVar56 + 1U);
        }
        pIVar54->TabFocusRequestNextWindow = (ImGuiWindow *)0x0;
        pIVar54->TabFocusRequestNextCounterTabStop = 0x7fffffff;
      }
      pIVar54->NavIdTabCounter = 0x7fffffff;
      uVar32 = (ctx_00->Windows).Size;
      if ((int)uVar32 < (ctx_00->WindowsFocusOrder).Size) {
        __assert_fail("g.WindowsFocusOrder.Size <= g.Windows.Size",
                      "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                      ,0x10ab,"void ImGui::NewFrame()");
      }
      fVar61 = 3.4028235e+38;
      if ((ctx_00->GcCompactAll == false) &&
         (fVar76 = (ctx_00->IO).ConfigMemoryCompactTimer, 0.0 <= fVar76)) {
        fVar61 = (float)ctx_00->Time - fVar76;
      }
      if (uVar32 != 0) {
        uVar50 = 0;
        do {
          if ((long)(int)uVar32 <= (long)uVar50) {
            pcVar42 = "T &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]";
            goto LAB_0012bd48;
          }
          pIVar37 = (ctx_00->Windows).Data[uVar50];
          bVar28 = pIVar37->Active;
          pIVar37->WasActive = bVar28;
          pIVar37->BeginCount = 0;
          pIVar37->Active = false;
          pIVar37->WriteAccessed = false;
          if (((bVar28 == false) && (pIVar37->MemoryCompacted == false)) &&
             (pIVar37->LastTimeActive <= fVar61 && fVar61 != pIVar37->LastTimeActive)) {
            GcCompactTransientWindowBuffers(pIVar37);
            uVar32 = (ctx_00->Windows).Size;
          }
          uVar50 = uVar50 + 1;
        } while (uVar50 != uVar32);
      }
      iVar56 = (ctx_00->TablesLastTimeActive).Size;
      if (0 < iVar56) {
        lVar51 = 0;
        lVar53 = 0;
        do {
          fVar76 = (ctx_00->TablesLastTimeActive).Data[lVar53];
          if ((0.0 <= fVar76) && (fVar76 < fVar61)) {
            if ((ctx_00->Tables).Buf.Size <= lVar53) {
              pcVar42 = "T &ImVector<ImGuiTable>::operator[](int) [T = ImGuiTable]";
              goto LAB_0012bd48;
            }
            TableGcCompactTransientBuffers
                      ((ImGuiTable *)((long)&((ctx_00->Tables).Buf.Data)->ID + lVar51));
            iVar56 = (ctx_00->TablesLastTimeActive).Size;
          }
          lVar53 = lVar53 + 1;
          lVar51 = lVar51 + 0x208;
        } while (lVar53 < iVar56);
      }
      iVar56 = (ctx_00->TablesTempData).Size;
      if (0 < iVar56) {
        lVar51 = 0;
        lVar53 = 0;
        do {
          pIVar21 = (ctx_00->TablesTempData).Data;
          fVar76 = *(float *)((long)&pIVar21->LastTimeActive + lVar51);
          if ((0.0 <= fVar76) && (fVar76 < fVar61)) {
            TableGcCompactTransientBuffers
                      ((ImGuiTableTempData *)((long)&pIVar21->TableIndex + lVar51));
            iVar56 = (ctx_00->TablesTempData).Size;
          }
          lVar53 = lVar53 + 1;
          lVar51 = lVar51 + 0x70;
        } while (lVar53 < iVar56);
      }
      if (ctx_00->GcCompactAll != false) {
        GcCompactTransientMiscBuffers();
      }
      ctx_00->GcCompactAll = false;
      if ((ctx_00->NavWindow != (ImGuiWindow *)0x0) && (ctx_00->NavWindow->WasActive == false)) {
        pIVar47 = (ImGuiContext *)0x0;
        FocusTopMostWindowUnderOne((ImGuiWindow *)0x0,(ImGuiWindow *)0x0);
      }
      if ((ctx_00->CurrentWindowStack).Capacity < 0) {
        if (GImGui != (ImGuiContext *)0x0) {
          piVar39 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar39 = *piVar39 + 1;
        }
        __dest_00 = (ImGuiWindowStackData *)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
        pIVar47 = (ImGuiContext *)(ctx_00->CurrentWindowStack).Data;
        if (pIVar47 != (ImGuiContext *)0x0) {
          memcpy(__dest_00,pIVar47,(long)(ctx_00->CurrentWindowStack).Size * 0x58);
          pIVar22 = (ctx_00->CurrentWindowStack).Data;
          if ((pIVar22 != (ImGuiWindowStackData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar39 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar39 = *piVar39 + -1;
          }
          pIVar47 = (ImGuiContext *)GImAllocatorUserData;
          (*GImAllocatorFreeFunc)(pIVar22,GImAllocatorUserData);
        }
        (ctx_00->CurrentWindowStack).Data = __dest_00;
        (ctx_00->CurrentWindowStack).Capacity = 0;
      }
      (ctx_00->CurrentWindowStack).Size = 0;
      if ((ctx_00->BeginPopupStack).Capacity < 0) {
        if (GImGui != (ImGuiContext *)0x0) {
          piVar39 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar39 = *piVar39 + 1;
        }
        __dest_01 = (ImGuiPopupData *)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
        pIVar47 = (ImGuiContext *)(ctx_00->BeginPopupStack).Data;
        if (pIVar47 != (ImGuiContext *)0x0) {
          memcpy(__dest_01,pIVar47,(long)(ctx_00->BeginPopupStack).Size * 0x30);
          pIVar23 = (ctx_00->BeginPopupStack).Data;
          if ((pIVar23 != (ImGuiPopupData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar39 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar39 = *piVar39 + -1;
          }
          pIVar47 = (ImGuiContext *)GImAllocatorUserData;
          (*GImAllocatorFreeFunc)(pIVar23,GImAllocatorUserData);
        }
        (ctx_00->BeginPopupStack).Data = __dest_01;
        (ctx_00->BeginPopupStack).Capacity = 0;
      }
      (ctx_00->BeginPopupStack).Size = 0;
      iVar56 = (ctx_00->ItemFlagsStack).Capacity;
      if (iVar56 < 0) {
        if (GImGui != (ImGuiContext *)0x0) {
          piVar39 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar39 = *piVar39 + 1;
        }
        piVar38 = (int *)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
        piVar39 = (ctx_00->ItemFlagsStack).Data;
        if (piVar39 != (int *)0x0) {
          memcpy(piVar38,piVar39,(long)(ctx_00->ItemFlagsStack).Size << 2);
          piVar39 = (ctx_00->ItemFlagsStack).Data;
          if ((piVar39 != (int *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar2 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar2 = *piVar2 + -1;
          }
          (*GImAllocatorFreeFunc)(piVar39,GImAllocatorUserData);
        }
        (ctx_00->ItemFlagsStack).Data = piVar38;
        (ctx_00->ItemFlagsStack).Size = 0;
        (ctx_00->ItemFlagsStack).Capacity = 0;
      }
      else {
        (ctx_00->ItemFlagsStack).Size = 0;
        if (iVar56 != 0) {
          piVar39 = (ctx_00->ItemFlagsStack).Data;
          lVar51 = 0;
          goto LAB_0012b22c;
        }
      }
      if (GImGui != (ImGuiContext *)0x0) {
        piVar39 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar39 = *piVar39 + 1;
      }
      piVar39 = (int *)(*GImAllocatorAllocFunc)(0x20,GImAllocatorUserData);
      pIVar47 = (ImGuiContext *)(ctx_00->ItemFlagsStack).Data;
      if (pIVar47 != (ImGuiContext *)0x0) {
        memcpy(piVar39,pIVar47,(long)(ctx_00->ItemFlagsStack).Size << 2);
        piVar38 = (ctx_00->ItemFlagsStack).Data;
        if ((piVar38 != (int *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar2 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar2 = *piVar2 + -1;
        }
        pIVar47 = (ImGuiContext *)GImAllocatorUserData;
        (*GImAllocatorFreeFunc)(piVar38,GImAllocatorUserData);
      }
      (ctx_00->ItemFlagsStack).Data = piVar39;
      (ctx_00->ItemFlagsStack).Capacity = 8;
      lVar51 = (long)(ctx_00->ItemFlagsStack).Size;
LAB_0012b22c:
      piVar39[lVar51] = 0;
      (ctx_00->ItemFlagsStack).Size = (ctx_00->ItemFlagsStack).Size + 1;
      if ((ctx_00->GroupStack).Capacity < 0) {
        if (GImGui != (ImGuiContext *)0x0) {
          piVar39 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar39 = *piVar39 + 1;
        }
        __dest_02 = (ImGuiGroupData *)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
        pIVar47 = (ImGuiContext *)(ctx_00->GroupStack).Data;
        if (pIVar47 != (ImGuiContext *)0x0) {
          memcpy(__dest_02,pIVar47,(long)(ctx_00->GroupStack).Size * 0x30);
          pIVar24 = (ctx_00->GroupStack).Data;
          if ((pIVar24 != (ImGuiGroupData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar39 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar39 = *piVar39 + -1;
          }
          pIVar47 = (ImGuiContext *)GImAllocatorUserData;
          (*GImAllocatorFreeFunc)(pIVar24,GImAllocatorUserData);
        }
        (ctx_00->GroupStack).Data = __dest_02;
        (ctx_00->GroupStack).Capacity = 0;
      }
      (ctx_00->GroupStack).Size = 0;
      DockContextNewFrameUpdateDocking((ImGui *)ctx_00,pIVar47);
      pIVar54 = GImGui;
      GImGui->DebugItemPickerBreakId = 0;
      if (pIVar54->DebugItemPickerActive == true) {
        uVar32 = pIVar54->HoveredIdPreviousFrame;
        pIVar54->MouseCursor = 7;
        iVar56 = (pIVar54->IO).KeyMap[0xe];
        if ((-1 < iVar56) && (bVar28 = IsKeyPressed(iVar56,true), bVar28)) {
          pIVar54->DebugItemPickerActive = false;
        }
        pIVar47 = GImGui;
        fVar61 = (GImGui->IO).MouseDownDuration[0];
        if ((fVar61 != 0.0) || (NAN(fVar61))) {
          uVar60 = (uint)(uVar32 == 0);
        }
        else if (uVar32 == 0) {
          uVar60 = 1;
        }
        else {
          pIVar54->DebugItemPickerBreakId = uVar32;
          pIVar54->DebugItemPickerActive = false;
          uVar60 = 0;
        }
        pIVar3 = &pIVar47->NextWindowData;
        *(byte *)&pIVar3->Flags = (byte)pIVar3->Flags | 0x40;
        (pIVar47->NextWindowData).BgAlphaVal = 0.6;
        BeginTooltipEx(0,0);
        Text("HoveredId: 0x%08X",(ulong)uVar32);
        Text("Press ESC to abort picking.");
        TextColored((ImVec4 *)((long)&(GImGui->Style).Colors[0].x + (ulong)(uVar60 << 4)),
                    "Click to break in debugger!");
        EndTooltip();
        pIVar54 = GImGui;
      }
      pIVar54->DebugHookIdInfo = 0;
      if (pIVar54->FrameCount == (pIVar54->DebugStackTool).LastActiveFrame + 1) {
        IVar40 = pIVar54->ActiveId;
        if (IVar40 == 0) {
          IVar40 = pIVar54->HoveredIdPreviousFrame;
        }
        if ((pIVar54->DebugStackTool).QueryId != IVar40) {
          (pIVar54->DebugStackTool).QueryId = IVar40;
          (pIVar54->DebugStackTool).StackLevel = -1;
          if ((pIVar54->DebugStackTool).Results.Capacity < 0) {
            piVar39 = &(pIVar54->IO).MetricsActiveAllocations;
            *piVar39 = *piVar39 + 1;
            __dest_03 = (ImGuiStackLevelInfo *)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
            pIVar25 = (pIVar54->DebugStackTool).Results.Data;
            if (pIVar25 != (ImGuiStackLevelInfo *)0x0) {
              memcpy(__dest_03,pIVar25,(long)(pIVar54->DebugStackTool).Results.Size << 6);
              pIVar25 = (pIVar54->DebugStackTool).Results.Data;
              if ((pIVar25 != (ImGuiStackLevelInfo *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
                piVar39 = &(GImGui->IO).MetricsActiveAllocations;
                *piVar39 = *piVar39 + -1;
              }
              (*GImAllocatorFreeFunc)(pIVar25,GImAllocatorUserData);
            }
            (pIVar54->DebugStackTool).Results.Data = __dest_03;
            (pIVar54->DebugStackTool).Results.Capacity = 0;
          }
          (pIVar54->DebugStackTool).Results.Size = 0;
        }
        if (IVar40 != 0) {
          uVar32 = (pIVar54->DebugStackTool).StackLevel;
          lVar51 = (long)(int)uVar32;
          if (lVar51 < 0) {
            if (uVar32 == 0xffffffff) {
              pIVar54->DebugHookIdInfo = IVar40;
            }
          }
          else {
            iVar56 = (pIVar54->DebugStackTool).Results.Size;
            if (((int)uVar32 < iVar56) &&
               ((pIVar25 = (pIVar54->DebugStackTool).Results.Data,
                pIVar25[lVar51].QuerySuccess != false || ('\x02' < pIVar25[lVar51].QueryFrameCount))
               )) {
              uVar32 = uVar32 + 1;
              (pIVar54->DebugStackTool).StackLevel = uVar32;
            }
            if ((int)uVar32 < iVar56) {
              pIVar25 = (pIVar54->DebugStackTool).Results.Data;
              pIVar54->DebugHookIdInfo = pIVar25[uVar32].ID;
              pIVar4 = &pIVar25[uVar32].QueryFrameCount;
              *pIVar4 = *pIVar4 + '\x01';
            }
          }
        }
      }
      ctx_00->WithinFrameScopeWithImplicitWindow = true;
      pIVar54 = GImGui;
      (GImGui->NextWindowData).Flags = (GImGui->NextWindowData).Flags | 2;
      (pIVar54->NextWindowData).SizeVal.x = 400.0;
      (pIVar54->NextWindowData).SizeVal.y = 400.0;
      (pIVar54->NextWindowData).SizeCond = 4;
      Begin("Debug##Default",(bool *)0x0,0);
      if (ctx_00->CurrentWindow->IsFallbackWindow != false) {
        iVar56 = (ctx_00->Hooks).Size;
        if (0 < iVar56) {
          lVar51 = 0;
          lVar53 = 0;
          do {
            pIVar11 = (ctx_00->Hooks).Data;
            if (*(int *)(pIVar11 + lVar51 + 4) == 1) {
              (**(code **)(pIVar11 + lVar51 + 0x10))(ctx_00,pIVar11 + lVar51);
              iVar56 = (ctx_00->Hooks).Size;
            }
            lVar53 = lVar53 + 1;
            lVar51 = lVar51 + 0x20;
          } while (lVar53 < iVar56);
        }
        return;
      }
      __assert_fail("g.CurrentWindow->IsFallbackWindow == true",
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                    ,0x10de,"void ImGui::NewFrame()");
    }
  }
LAB_0012bc52:
  pcVar42 = "T &ImVector<ImGuiViewportP *>::operator[](int) [T = ImGuiViewportP *]";
LAB_0012bd48:
  __assert_fail("i >= 0 && i < Size",
                "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.h"
                ,0x706,pcVar42);
}

Assistant:

void ImGui::NewFrame()
{
    IM_ASSERT(GImGui != NULL && "No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?");
    ImGuiContext& g = *GImGui;

    // Remove pending delete hooks before frame start.
    // This deferred removal avoid issues of removal while iterating the hook vector
    for (int n = g.Hooks.Size - 1; n >= 0; n--)
        if (g.Hooks[n].Type == ImGuiContextHookType_PendingRemoval_)
            g.Hooks.erase(&g.Hooks[n]);

    CallContextHooks(&g, ImGuiContextHookType_NewFramePre);

    // Check and assert for various common IO and Configuration mistakes
    g.ConfigFlagsLastFrame = g.ConfigFlagsCurrFrame;
    ErrorCheckNewFrameSanityChecks();
    g.ConfigFlagsCurrFrame = g.IO.ConfigFlags;

    // Load settings on first frame, save settings when modified (after a delay)
    UpdateSettings();

    g.Time += g.IO.DeltaTime;
    g.WithinFrameScope = true;
    g.FrameCount += 1;
    g.TooltipOverrideCount = 0;
    g.WindowsActiveCount = 0;
    g.MenusIdSubmittedThisFrame.resize(0);

    // Calculate frame-rate for the user, as a purely luxurious feature
    g.FramerateSecPerFrameAccum += g.IO.DeltaTime - g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx];
    g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx] = g.IO.DeltaTime;
    g.FramerateSecPerFrameIdx = (g.FramerateSecPerFrameIdx + 1) % IM_ARRAYSIZE(g.FramerateSecPerFrame);
    g.FramerateSecPerFrameCount = ImMin(g.FramerateSecPerFrameCount + 1, IM_ARRAYSIZE(g.FramerateSecPerFrame));
    g.IO.Framerate = (g.FramerateSecPerFrameAccum > 0.0f) ? (1.0f / (g.FramerateSecPerFrameAccum / (float)g.FramerateSecPerFrameCount)) : FLT_MAX;

    UpdateViewportsNewFrame();

    // Setup current font and draw list shared data
    // FIXME-VIEWPORT: the concept of a single ClipRectFullscreen is not ideal!
    g.IO.Fonts->Locked = true;
    SetCurrentFont(GetDefaultFont());
    IM_ASSERT(g.Font->IsLoaded());
    ImRect virtual_space(FLT_MAX, FLT_MAX, -FLT_MAX, -FLT_MAX);
    for (int n = 0; n < g.Viewports.Size; n++)
        virtual_space.Add(g.Viewports[n]->GetMainRect());
    g.DrawListSharedData.ClipRectFullscreen = virtual_space.ToVec4();
    g.DrawListSharedData.CurveTessellationTol = g.Style.CurveTessellationTol;
    g.DrawListSharedData.SetCircleTessellationMaxError(g.Style.CircleTessellationMaxError);
    g.DrawListSharedData.InitialFlags = ImDrawListFlags_None;
    if (g.Style.AntiAliasedLines)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedLines;
    if (g.Style.AntiAliasedLinesUseTex && !(g.Font->ContainerAtlas->Flags & ImFontAtlasFlags_NoBakedLines))
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedLinesUseTex;
    if (g.Style.AntiAliasedFill)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedFill;
    if (g.IO.BackendFlags & ImGuiBackendFlags_RendererHasVtxOffset)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AllowVtxOffset;

    // Mark rendering data as invalid to prevent user who may have a handle on it to use it.
    for (int n = 0; n < g.Viewports.Size; n++)
    {
        ImGuiViewportP* viewport = g.Viewports[n];
        viewport->DrawData = NULL;
        viewport->DrawDataP.Clear();
    }

    // Drag and drop keep the source ID alive so even if the source disappear our state is consistent
    if (g.DragDropActive && g.DragDropPayload.SourceId == g.ActiveId)
        KeepAliveID(g.DragDropPayload.SourceId);

    // Update HoveredId data
    if (!g.HoveredIdPreviousFrame)
        g.HoveredIdTimer = 0.0f;
    if (!g.HoveredIdPreviousFrame || (g.HoveredId && g.ActiveId == g.HoveredId))
        g.HoveredIdNotActiveTimer = 0.0f;
    if (g.HoveredId)
        g.HoveredIdTimer += g.IO.DeltaTime;
    if (g.HoveredId && g.ActiveId != g.HoveredId)
        g.HoveredIdNotActiveTimer += g.IO.DeltaTime;
    g.HoveredIdPreviousFrame = g.HoveredId;
    g.HoveredIdPreviousFrameUsingMouseWheel = g.HoveredIdUsingMouseWheel;
    g.HoveredId = 0;
    g.HoveredIdAllowOverlap = false;
    g.HoveredIdUsingMouseWheel = false;
    g.HoveredIdDisabled = false;

    // Update ActiveId data (clear reference to active widget if the widget isn't alive anymore)
    if (g.ActiveIdIsAlive != g.ActiveId && g.ActiveIdPreviousFrame == g.ActiveId && g.ActiveId != 0)
        ClearActiveID();
    if (g.ActiveId)
        g.ActiveIdTimer += g.IO.DeltaTime;
    g.LastActiveIdTimer += g.IO.DeltaTime;
    g.ActiveIdPreviousFrame = g.ActiveId;
    g.ActiveIdPreviousFrameWindow = g.ActiveIdWindow;
    g.ActiveIdPreviousFrameHasBeenEditedBefore = g.ActiveIdHasBeenEditedBefore;
    g.ActiveIdIsAlive = 0;
    g.ActiveIdHasBeenEditedThisFrame = false;
    g.ActiveIdPreviousFrameIsAlive = false;
    g.ActiveIdIsJustActivated = false;
    if (g.TempInputId != 0 && g.ActiveId != g.TempInputId)
        g.TempInputId = 0;
    if (g.ActiveId == 0)
    {
        g.ActiveIdUsingNavDirMask = 0x00;
        g.ActiveIdUsingNavInputMask = 0x00;
        g.ActiveIdUsingKeyInputMask = 0x00;
    }

    // Drag and drop
    g.DragDropAcceptIdPrev = g.DragDropAcceptIdCurr;
    g.DragDropAcceptIdCurr = 0;
    g.DragDropAcceptIdCurrRectSurface = FLT_MAX;
    g.DragDropWithinSource = false;
    g.DragDropWithinTarget = false;
    g.DragDropHoldJustPressedId = 0;

    // Close popups on focus lost (currently wip/opt-in)
    //if (g.IO.AppFocusLost)
    //    ClosePopupsExceptModals();

    // Clear buttons state when focus is lost
    // (this is useful so e.g. releasing Alt after focus loss on Alt-Tab doesn't trigger the Alt menu toggle)
    if (g.IO.AppFocusLost)
    {
        g.IO.ClearInputKeys();
        g.IO.AppFocusLost = false;
    }

    // Update keyboard input state
    // Synchronize io.KeyMods with individual modifiers io.KeyXXX bools
    g.IO.KeyMods = GetMergedKeyModFlags();
    memcpy(g.IO.KeysDownDurationPrev, g.IO.KeysDownDuration, sizeof(g.IO.KeysDownDuration));
    for (int i = 0; i < IM_ARRAYSIZE(g.IO.KeysDown); i++)
        g.IO.KeysDownDuration[i] = g.IO.KeysDown[i] ? (g.IO.KeysDownDuration[i] < 0.0f ? 0.0f : g.IO.KeysDownDuration[i] + g.IO.DeltaTime) : -1.0f;

    // Update gamepad/keyboard navigation
    NavUpdate();

    // Update mouse input state
    UpdateMouseInputs();

    // Undocking
    // (needs to be before UpdateMouseMovingWindowNewFrame so the window is already offset and following the mouse on the detaching frame)
    DockContextNewFrameUpdateUndocking(&g);

    // Find hovered window
    // (needs to be before UpdateMouseMovingWindowNewFrame so we fill g.HoveredWindowUnderMovingWindow on the mouse release frame)
    UpdateHoveredWindowAndCaptureFlags();

    // Handle user moving window with mouse (at the beginning of the frame to avoid input lag or sheering)
    UpdateMouseMovingWindowNewFrame();

    // Background darkening/whitening
    if (GetTopMostPopupModal() != NULL || (g.NavWindowingTarget != NULL && g.NavWindowingHighlightAlpha > 0.0f))
        g.DimBgRatio = ImMin(g.DimBgRatio + g.IO.DeltaTime * 6.0f, 1.0f);
    else
        g.DimBgRatio = ImMax(g.DimBgRatio - g.IO.DeltaTime * 10.0f, 0.0f);

    g.MouseCursor = ImGuiMouseCursor_Arrow;
    g.WantCaptureMouseNextFrame = g.WantCaptureKeyboardNextFrame = g.WantTextInputNextFrame = -1;
    g.PlatformImePos = ImVec2(1.0f, 1.0f); // OS Input Method Editor showing on top-left of our window by default
    g.PlatformImePosViewport = NULL;

    // Mouse wheel scrolling, scale
    UpdateMouseWheel();

    // Update legacy TAB focus
    UpdateTabFocus();

    // Mark all windows as not visible and compact unused memory.
    IM_ASSERT(g.WindowsFocusOrder.Size <= g.Windows.Size);
    const float memory_compact_start_time = (g.GcCompactAll || g.IO.ConfigMemoryCompactTimer < 0.0f) ? FLT_MAX : (float)g.Time - g.IO.ConfigMemoryCompactTimer;
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        window->WasActive = window->Active;
        window->BeginCount = 0;
        window->Active = false;
        window->WriteAccessed = false;

        // Garbage collect transient buffers of recently unused windows
        if (!window->WasActive && !window->MemoryCompacted && window->LastTimeActive < memory_compact_start_time)
            GcCompactTransientWindowBuffers(window);
    }

    // Garbage collect transient buffers of recently unused tables
    for (int i = 0; i < g.TablesLastTimeActive.Size; i++)
        if (g.TablesLastTimeActive[i] >= 0.0f && g.TablesLastTimeActive[i] < memory_compact_start_time)
            TableGcCompactTransientBuffers(g.Tables.GetByIndex(i));
    for (int i = 0; i < g.TablesTempData.Size; i++)
        if (g.TablesTempData[i].LastTimeActive >= 0.0f && g.TablesTempData[i].LastTimeActive < memory_compact_start_time)
            TableGcCompactTransientBuffers(&g.TablesTempData[i]);
    if (g.GcCompactAll)
        GcCompactTransientMiscBuffers();
    g.GcCompactAll = false;

    // Closing the focused window restore focus to the first active root window in descending z-order
    if (g.NavWindow && !g.NavWindow->WasActive)
        FocusTopMostWindowUnderOne(NULL, NULL);

    // No window should be open at the beginning of the frame.
    // But in order to allow the user to call NewFrame() multiple times without calling Render(), we are doing an explicit clear.
    g.CurrentWindowStack.resize(0);
    g.BeginPopupStack.resize(0);
    g.ItemFlagsStack.resize(0);
    g.ItemFlagsStack.push_back(ImGuiItemFlags_None);
    g.GroupStack.resize(0);

    // Docking
    DockContextNewFrameUpdateDocking(&g);

    // [DEBUG] Update debug features
    UpdateDebugToolItemPicker();
    UpdateDebugToolStackQueries();

    // Create implicit/fallback window - which we will only render it if the user has added something to it.
    // We don't use "Debug" to avoid colliding with user trying to create a "Debug" window with custom flags.
    // This fallback is particularly important as it avoid ImGui:: calls from crashing.
    g.WithinFrameScopeWithImplicitWindow = true;
    SetNextWindowSize(ImVec2(400, 400), ImGuiCond_FirstUseEver);
    Begin("Debug##Default");
    IM_ASSERT(g.CurrentWindow->IsFallbackWindow == true);

    CallContextHooks(&g, ImGuiContextHookType_NewFramePost);
}